

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  uint uVar12;
  int iVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  ulong uVar70;
  long lVar71;
  ulong uVar72;
  long lVar73;
  ulong uVar74;
  ulong uVar75;
  uint uVar76;
  Geometry *geometry;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  long lVar77;
  byte bVar78;
  float fVar79;
  float fVar80;
  float fVar125;
  float fVar126;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar86 [16];
  float fVar127;
  float fVar129;
  float fVar130;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar128;
  float fVar131;
  float fVar132;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar133;
  float fVar134;
  undefined4 uVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar139;
  undefined1 auVar138 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined8 uVar140;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar150;
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar169;
  float fVar171;
  undefined1 auVar170 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [32];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  LinearSpace3fa *local_5d0;
  Primitive *local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar186 [64];
  
  PVar11 = prim[1];
  uVar70 = (ulong)(byte)PVar11;
  lVar26 = uVar70 * 0x25;
  fVar151 = *(float *)(prim + lVar26 + 0x12);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar84 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar85 = vsubps_avx(auVar81,*(undefined1 (*) [16])(prim + lVar26 + 6));
  fVar150 = fVar151 * auVar85._0_4_;
  fVar133 = fVar151 * auVar84._0_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar90 = vpmovsxbd_avx2(auVar82);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar91 = vpmovsxbd_avx2(auVar83);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar70 * 0xf + 6);
  auVar92 = vpmovsxbd_avx2(auVar6);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar96 = vpmovsxbd_avx2(auVar197);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar94 = vcvtdq2ps_avx(auVar96);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar70 + 6);
  auVar95 = vpmovsxbd_avx2(auVar7);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar70 * 0x1a + 6);
  auVar102 = vpmovsxbd_avx2(auVar8);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar70 * 0x1b + 6);
  auVar101 = vpmovsxbd_avx2(auVar9);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar70 * 0x1c + 6);
  auVar89 = vpmovsxbd_avx2(auVar10);
  auVar97 = vcvtdq2ps_avx(auVar89);
  auVar166._4_4_ = fVar133;
  auVar166._0_4_ = fVar133;
  auVar166._8_4_ = fVar133;
  auVar166._12_4_ = fVar133;
  auVar166._16_4_ = fVar133;
  auVar166._20_4_ = fVar133;
  auVar166._24_4_ = fVar133;
  auVar166._28_4_ = fVar133;
  auVar188._8_4_ = 1;
  auVar188._0_8_ = 0x100000001;
  auVar188._12_4_ = 1;
  auVar188._16_4_ = 1;
  auVar188._20_4_ = 1;
  auVar188._24_4_ = 1;
  auVar188._28_4_ = 1;
  auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar99 = ZEXT1632(CONCAT412(fVar151 * auVar84._12_4_,
                               CONCAT48(fVar151 * auVar84._8_4_,
                                        CONCAT44(fVar151 * auVar84._4_4_,fVar133))));
  auVar98 = vpermps_avx2(auVar188,auVar99);
  auVar88 = vpermps_avx512vl(auVar87,auVar99);
  fVar134 = auVar88._0_4_;
  fVar139 = auVar88._4_4_;
  auVar99._4_4_ = fVar139 * auVar91._4_4_;
  auVar99._0_4_ = fVar134 * auVar91._0_4_;
  fVar169 = auVar88._8_4_;
  auVar99._8_4_ = fVar169 * auVar91._8_4_;
  fVar171 = auVar88._12_4_;
  auVar99._12_4_ = fVar171 * auVar91._12_4_;
  fVar79 = auVar88._16_4_;
  auVar99._16_4_ = fVar79 * auVar91._16_4_;
  fVar80 = auVar88._20_4_;
  auVar99._20_4_ = fVar80 * auVar91._20_4_;
  fVar125 = auVar88._24_4_;
  auVar99._24_4_ = fVar125 * auVar91._24_4_;
  auVar99._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar95._4_4_ * fVar139;
  auVar96._0_4_ = auVar95._0_4_ * fVar134;
  auVar96._8_4_ = auVar95._8_4_ * fVar169;
  auVar96._12_4_ = auVar95._12_4_ * fVar171;
  auVar96._16_4_ = auVar95._16_4_ * fVar79;
  auVar96._20_4_ = auVar95._20_4_ * fVar80;
  auVar96._24_4_ = auVar95._24_4_ * fVar125;
  auVar96._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar97._4_4_ * fVar139;
  auVar89._0_4_ = auVar97._0_4_ * fVar134;
  auVar89._8_4_ = auVar97._8_4_ * fVar169;
  auVar89._12_4_ = auVar97._12_4_ * fVar171;
  auVar89._16_4_ = auVar97._16_4_ * fVar79;
  auVar89._20_4_ = auVar97._20_4_ * fVar80;
  auVar89._24_4_ = auVar97._24_4_ * fVar125;
  auVar89._28_4_ = auVar88._28_4_;
  auVar81 = vfmadd231ps_fma(auVar99,auVar98,auVar90);
  auVar82 = vfmadd231ps_fma(auVar96,auVar98,auVar94);
  auVar83 = vfmadd231ps_fma(auVar89,auVar101,auVar98);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar166,auVar93);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar166,auVar92);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar102,auVar166);
  auVar183._4_4_ = fVar150;
  auVar183._0_4_ = fVar150;
  auVar183._8_4_ = fVar150;
  auVar183._12_4_ = fVar150;
  auVar183._16_4_ = fVar150;
  auVar183._20_4_ = fVar150;
  auVar183._24_4_ = fVar150;
  auVar183._28_4_ = fVar150;
  auVar89 = ZEXT1632(CONCAT412(fVar151 * auVar85._12_4_,
                               CONCAT48(fVar151 * auVar85._8_4_,
                                        CONCAT44(fVar151 * auVar85._4_4_,fVar150))));
  auVar96 = vpermps_avx2(auVar188,auVar89);
  auVar89 = vpermps_avx512vl(auVar87,auVar89);
  fVar151 = auVar89._0_4_;
  fVar134 = auVar89._4_4_;
  auVar98._4_4_ = fVar134 * auVar91._4_4_;
  auVar98._0_4_ = fVar151 * auVar91._0_4_;
  fVar139 = auVar89._8_4_;
  auVar98._8_4_ = fVar139 * auVar91._8_4_;
  fVar169 = auVar89._12_4_;
  auVar98._12_4_ = fVar169 * auVar91._12_4_;
  fVar171 = auVar89._16_4_;
  auVar98._16_4_ = fVar171 * auVar91._16_4_;
  fVar79 = auVar89._20_4_;
  auVar98._20_4_ = fVar79 * auVar91._20_4_;
  fVar80 = auVar89._24_4_;
  auVar98._24_4_ = fVar80 * auVar91._24_4_;
  auVar98._28_4_ = fVar133;
  auVar87._4_4_ = auVar95._4_4_ * fVar134;
  auVar87._0_4_ = auVar95._0_4_ * fVar151;
  auVar87._8_4_ = auVar95._8_4_ * fVar139;
  auVar87._12_4_ = auVar95._12_4_ * fVar169;
  auVar87._16_4_ = auVar95._16_4_ * fVar171;
  auVar87._20_4_ = auVar95._20_4_ * fVar79;
  auVar87._24_4_ = auVar95._24_4_ * fVar80;
  auVar87._28_4_ = auVar91._28_4_;
  auVar95._4_4_ = auVar97._4_4_ * fVar134;
  auVar95._0_4_ = auVar97._0_4_ * fVar151;
  auVar95._8_4_ = auVar97._8_4_ * fVar139;
  auVar95._12_4_ = auVar97._12_4_ * fVar169;
  auVar95._16_4_ = auVar97._16_4_ * fVar171;
  auVar95._20_4_ = auVar97._20_4_ * fVar79;
  auVar95._24_4_ = auVar97._24_4_ * fVar80;
  auVar95._28_4_ = auVar89._28_4_;
  auVar6 = vfmadd231ps_fma(auVar98,auVar96,auVar90);
  auVar197 = vfmadd231ps_fma(auVar87,auVar96,auVar94);
  auVar7 = vfmadd231ps_fma(auVar95,auVar96,auVar101);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar183,auVar93);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar183,auVar92);
  auVar175._8_4_ = 0x7fffffff;
  auVar175._0_8_ = 0x7fffffff7fffffff;
  auVar175._12_4_ = 0x7fffffff;
  auVar175._16_4_ = 0x7fffffff;
  auVar175._20_4_ = 0x7fffffff;
  auVar175._24_4_ = 0x7fffffff;
  auVar175._28_4_ = 0x7fffffff;
  auVar141 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar183,auVar102);
  auVar93 = vandps_avx(auVar175,ZEXT1632(auVar81));
  auVar172._8_4_ = 0x219392ef;
  auVar172._0_8_ = 0x219392ef219392ef;
  auVar172._12_4_ = 0x219392ef;
  auVar172._16_4_ = 0x219392ef;
  auVar172._20_4_ = 0x219392ef;
  auVar172._24_4_ = 0x219392ef;
  auVar172._28_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar93,auVar172,1);
  bVar17 = (bool)((byte)uVar72 & 1);
  auVar88._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._0_4_;
  bVar17 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._4_4_;
  bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._8_4_;
  bVar17 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar81._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(auVar175,ZEXT1632(auVar82));
  uVar72 = vcmpps_avx512vl(auVar93,auVar172,1);
  bVar17 = (bool)((byte)uVar72 & 1);
  auVar100._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar82._0_4_;
  bVar17 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar82._4_4_;
  bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar82._8_4_;
  bVar17 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar82._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(auVar175,ZEXT1632(auVar83));
  uVar72 = vcmpps_avx512vl(auVar93,auVar172,1);
  bVar17 = (bool)((byte)uVar72 & 1);
  auVar93._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar83._0_4_;
  bVar17 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar83._4_4_;
  bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar83._8_4_;
  bVar17 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar83._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar90 = vrcp14ps_avx512vl(auVar88);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar92 = vfnmadd213ps_avx512vl(auVar88,auVar90,auVar91);
  auVar81 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar100);
  auVar92 = vfnmadd213ps_avx512vl(auVar100,auVar90,auVar91);
  auVar82 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar93);
  auVar93 = vfnmadd213ps_avx512vl(auVar93,auVar90,auVar91);
  auVar83 = vfmadd132ps_fma(auVar93,auVar90,auVar90);
  fVar151 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar26 + 0x16)) *
            *(float *)(prim + lVar26 + 0x1a);
  auVar170._4_4_ = fVar151;
  auVar170._0_4_ = fVar151;
  auVar170._8_4_ = fVar151;
  auVar170._12_4_ = fVar151;
  auVar170._16_4_ = fVar151;
  auVar170._20_4_ = fVar151;
  auVar170._24_4_ = fVar151;
  auVar170._28_4_ = fVar151;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0xb + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar6 = vfmadd213ps_fma(auVar90,auVar170,auVar93);
  auVar93 = vcvtdq2ps_avx(auVar91);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0xd + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar197 = vfmadd213ps_fma(auVar90,auVar170,auVar93);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x12 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar72 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 2 + uVar72 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar7 = vfmadd213ps_fma(auVar90,auVar170,auVar93);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x18 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar8 = vfmadd213ps_fma(auVar90,auVar170,auVar93);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x1d + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 + (ulong)(byte)PVar11 * 0x20 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar9 = vfmadd213ps_fma(auVar90,auVar170,auVar93);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar11 * 0x20 - uVar70) + 6))
  ;
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x23 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar93);
  auVar10 = vfmadd213ps_fma(auVar90,auVar170,auVar93);
  auVar93 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar84));
  auVar102._4_4_ = auVar81._4_4_ * auVar93._4_4_;
  auVar102._0_4_ = auVar81._0_4_ * auVar93._0_4_;
  auVar102._8_4_ = auVar81._8_4_ * auVar93._8_4_;
  auVar102._12_4_ = auVar81._12_4_ * auVar93._12_4_;
  auVar102._16_4_ = auVar93._16_4_ * 0.0;
  auVar102._20_4_ = auVar93._20_4_ * 0.0;
  auVar102._24_4_ = auVar93._24_4_ * 0.0;
  auVar102._28_4_ = auVar93._28_4_;
  auVar93 = vsubps_avx(ZEXT1632(auVar197),ZEXT1632(auVar84));
  auVar148._0_4_ = auVar81._0_4_ * auVar93._0_4_;
  auVar148._4_4_ = auVar81._4_4_ * auVar93._4_4_;
  auVar148._8_4_ = auVar81._8_4_ * auVar93._8_4_;
  auVar148._12_4_ = auVar81._12_4_ * auVar93._12_4_;
  auVar148._16_4_ = auVar93._16_4_ * 0.0;
  auVar148._20_4_ = auVar93._20_4_ * 0.0;
  auVar148._24_4_ = auVar93._24_4_ * 0.0;
  auVar148._28_4_ = 0;
  auVar93 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar85));
  auVar101._4_4_ = auVar82._4_4_ * auVar93._4_4_;
  auVar101._0_4_ = auVar82._0_4_ * auVar93._0_4_;
  auVar101._8_4_ = auVar82._8_4_ * auVar93._8_4_;
  auVar101._12_4_ = auVar82._12_4_ * auVar93._12_4_;
  auVar101._16_4_ = auVar93._16_4_ * 0.0;
  auVar101._20_4_ = auVar93._20_4_ * 0.0;
  auVar101._24_4_ = auVar93._24_4_ * 0.0;
  auVar101._28_4_ = auVar93._28_4_;
  auVar93 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar85));
  auVar144._0_4_ = auVar82._0_4_ * auVar93._0_4_;
  auVar144._4_4_ = auVar82._4_4_ * auVar93._4_4_;
  auVar144._8_4_ = auVar82._8_4_ * auVar93._8_4_;
  auVar144._12_4_ = auVar82._12_4_ * auVar93._12_4_;
  auVar144._16_4_ = auVar93._16_4_ * 0.0;
  auVar144._20_4_ = auVar93._20_4_ * 0.0;
  auVar144._24_4_ = auVar93._24_4_ * 0.0;
  auVar144._28_4_ = 0;
  auVar93 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar141));
  auVar97._4_4_ = auVar83._4_4_ * auVar93._4_4_;
  auVar97._0_4_ = auVar83._0_4_ * auVar93._0_4_;
  auVar97._8_4_ = auVar83._8_4_ * auVar93._8_4_;
  auVar97._12_4_ = auVar83._12_4_ * auVar93._12_4_;
  auVar97._16_4_ = auVar93._16_4_ * 0.0;
  auVar97._20_4_ = auVar93._20_4_ * 0.0;
  auVar97._24_4_ = auVar93._24_4_ * 0.0;
  auVar97._28_4_ = auVar93._28_4_;
  auVar93 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar141));
  auVar114._0_4_ = auVar83._0_4_ * auVar93._0_4_;
  auVar114._4_4_ = auVar83._4_4_ * auVar93._4_4_;
  auVar114._8_4_ = auVar83._8_4_ * auVar93._8_4_;
  auVar114._12_4_ = auVar83._12_4_ * auVar93._12_4_;
  auVar114._16_4_ = auVar93._16_4_ * 0.0;
  auVar114._20_4_ = auVar93._20_4_ * 0.0;
  auVar114._24_4_ = auVar93._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar102,auVar148);
  auVar90 = vpminsd_avx2(auVar101,auVar144);
  auVar93 = vmaxps_avx(auVar93,auVar90);
  auVar90 = vpminsd_avx2(auVar97,auVar114);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar91._4_4_ = uVar135;
  auVar91._0_4_ = uVar135;
  auVar91._8_4_ = uVar135;
  auVar91._12_4_ = uVar135;
  auVar91._16_4_ = uVar135;
  auVar91._20_4_ = uVar135;
  auVar91._24_4_ = uVar135;
  auVar91._28_4_ = uVar135;
  auVar90 = vmaxps_avx512vl(auVar90,auVar91);
  auVar93 = vmaxps_avx(auVar93,auVar90);
  auVar90._8_4_ = 0x3f7ffffa;
  auVar90._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar90._12_4_ = 0x3f7ffffa;
  auVar90._16_4_ = 0x3f7ffffa;
  auVar90._20_4_ = 0x3f7ffffa;
  auVar90._24_4_ = 0x3f7ffffa;
  auVar90._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar93,auVar90);
  auVar93 = vpmaxsd_avx2(auVar102,auVar148);
  auVar90 = vpmaxsd_avx2(auVar101,auVar144);
  auVar93 = vminps_avx(auVar93,auVar90);
  auVar90 = vpmaxsd_avx2(auVar97,auVar114);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar92._4_4_ = uVar135;
  auVar92._0_4_ = uVar135;
  auVar92._8_4_ = uVar135;
  auVar92._12_4_ = uVar135;
  auVar92._16_4_ = uVar135;
  auVar92._20_4_ = uVar135;
  auVar92._24_4_ = uVar135;
  auVar92._28_4_ = uVar135;
  auVar90 = vminps_avx512vl(auVar90,auVar92);
  auVar93 = vminps_avx(auVar93,auVar90);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar94);
  auVar90 = vpbroadcastd_avx512vl();
  uVar25 = vpcmpgtd_avx512vl(auVar90,_DAT_01fe9900);
  uVar140 = vcmpps_avx512vl(local_80,auVar93,2);
  if ((byte)((byte)uVar140 & (byte)uVar25) == 0) {
    bVar78 = 0;
  }
  else {
    uVar72 = (ulong)(byte)((byte)uVar140 & (byte)uVar25);
    local_5d0 = pre->ray_space + k;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_5c8 = prim;
    do {
      lVar26 = 0;
      for (uVar70 = uVar72; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar12 = *(uint *)(local_5c8 + 2);
      pGVar14 = (context->scene->geometries).items[uVar12].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(local_5c8 + lVar26 * 4 + 6));
      uVar70 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                               CONCAT44(0,*(uint *)(local_5c8 + lVar26 * 4 + 6)) *
                               pGVar14[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar151 = (pGVar14->time_range).lower;
      fVar151 = pGVar14->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar151) /
                ((pGVar14->time_range).upper - fVar151));
      auVar81 = vroundss_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar151),9);
      auVar81 = vminss_avx(auVar81,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
      auVar81 = vmaxss_avx(ZEXT816(0) << 0x20,auVar81);
      fVar151 = fVar151 - auVar81._0_4_;
      _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar73 = (long)(int)auVar81._0_4_ * 0x38;
      lVar26 = *(long *)(_Var15 + 0x10 + lVar73);
      lVar77 = *(long *)(_Var15 + 0x38 + lVar73);
      lVar71 = *(long *)(_Var15 + 0x48 + lVar73);
      auVar85._4_4_ = fVar151;
      auVar85._0_4_ = fVar151;
      auVar85._8_4_ = fVar151;
      auVar85._12_4_ = fVar151;
      pfVar3 = (float *)(lVar77 + uVar70 * lVar71);
      auVar174._0_4_ = fVar151 * *pfVar3;
      auVar174._4_4_ = fVar151 * pfVar3[1];
      auVar174._8_4_ = fVar151 * pfVar3[2];
      auVar174._12_4_ = fVar151 * pfVar3[3];
      pfVar3 = (float *)(lVar77 + (uVar70 + 1) * lVar71);
      auVar177._0_4_ = fVar151 * *pfVar3;
      auVar177._4_4_ = fVar151 * pfVar3[1];
      auVar177._8_4_ = fVar151 * pfVar3[2];
      auVar177._12_4_ = fVar151 * pfVar3[3];
      uVar74 = (uVar70 + 2) * lVar71;
      auVar81 = vmulps_avx512vl(auVar85,*(undefined1 (*) [16])(lVar77 + uVar74));
      auVar82 = vmulps_avx512vl(auVar85,*(undefined1 (*) [16])(lVar77 + lVar71 * (uVar70 + 3)));
      lVar77 = *(long *)(_Var15 + lVar73);
      fVar151 = 1.0 - fVar151;
      auVar84._4_4_ = fVar151;
      auVar84._0_4_ = fVar151;
      auVar84._8_4_ = fVar151;
      auVar84._12_4_ = fVar151;
      local_670 = vfmadd231ps_fma(auVar174,auVar84,*(undefined1 (*) [16])(lVar77 + lVar26 * uVar70))
      ;
      local_680 = vfmadd231ps_fma(auVar177,auVar84,
                                  *(undefined1 (*) [16])(lVar77 + lVar26 * (uVar70 + 1)));
      local_690 = vfmadd231ps_avx512vl
                            (auVar81,auVar84,*(undefined1 (*) [16])(lVar77 + lVar26 * (uVar70 + 2)))
      ;
      _local_4d0 = vfmadd231ps_avx512vl
                             (auVar82,auVar84,*(undefined1 (*) [16])(lVar77 + lVar26 * (uVar70 + 3))
                             );
      iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      lVar26 = (long)iVar13 * 0x44;
      auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar83 = vsubps_avx(local_670,auVar81);
      uVar135 = auVar83._0_4_;
      auVar86._4_4_ = uVar135;
      auVar86._0_4_ = uVar135;
      auVar86._8_4_ = uVar135;
      auVar86._12_4_ = uVar135;
      auVar82 = vshufps_avx(auVar83,auVar83,0x55);
      aVar4 = (local_5d0->vx).field_0;
      aVar5 = (local_5d0->vy).field_0;
      fVar151 = (local_5d0->vz).field_0.m128[0];
      fVar133 = *(float *)((long)&(local_5d0->vz).field_0 + 4);
      fVar134 = *(float *)((long)&(local_5d0->vz).field_0 + 8);
      fVar139 = *(float *)((long)&(local_5d0->vz).field_0 + 0xc);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar179._0_4_ = fVar151 * auVar83._0_4_;
      auVar179._4_4_ = fVar133 * auVar83._4_4_;
      auVar179._8_4_ = fVar134 * auVar83._8_4_;
      auVar179._12_4_ = fVar139 * auVar83._12_4_;
      auVar82 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar82);
      auVar6 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar86);
      auVar83 = vsubps_avx(local_680,auVar81);
      uVar135 = auVar83._0_4_;
      auVar146._4_4_ = uVar135;
      auVar146._0_4_ = uVar135;
      auVar146._8_4_ = uVar135;
      auVar146._12_4_ = uVar135;
      auVar82 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar180._0_4_ = fVar151 * auVar83._0_4_;
      auVar180._4_4_ = fVar133 * auVar83._4_4_;
      auVar180._8_4_ = fVar134 * auVar83._8_4_;
      auVar180._12_4_ = fVar139 * auVar83._12_4_;
      auVar82 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar5,auVar82);
      auVar197 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar146);
      auVar83 = vsubps_avx512vl(local_690,auVar81);
      uVar135 = auVar83._0_4_;
      auVar147._4_4_ = uVar135;
      auVar147._0_4_ = uVar135;
      auVar147._8_4_ = uVar135;
      auVar147._12_4_ = uVar135;
      auVar82 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar181._0_4_ = fVar151 * auVar83._0_4_;
      auVar181._4_4_ = fVar133 * auVar83._4_4_;
      auVar181._8_4_ = fVar134 * auVar83._8_4_;
      auVar181._12_4_ = fVar139 * auVar83._12_4_;
      auVar82 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar5,auVar82);
      auVar83 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar147);
      auVar82 = vsubps_avx512vl(_local_4d0,auVar81);
      uVar135 = auVar82._0_4_;
      auVar141._4_4_ = uVar135;
      auVar141._0_4_ = uVar135;
      auVar141._8_4_ = uVar135;
      auVar141._12_4_ = uVar135;
      auVar81 = vshufps_avx(auVar82,auVar82,0x55);
      auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
      auVar187._0_4_ = fVar151 * auVar82._0_4_;
      auVar187._4_4_ = fVar133 * auVar82._4_4_;
      auVar187._8_4_ = fVar134 * auVar82._8_4_;
      auVar187._12_4_ = fVar139 * auVar82._12_4_;
      auVar81 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar81);
      auVar7 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar141);
      auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26);
      uVar135 = auVar6._0_4_;
      local_540._4_4_ = uVar135;
      local_540._0_4_ = uVar135;
      local_540._8_4_ = uVar135;
      local_540._12_4_ = uVar135;
      local_540._16_4_ = uVar135;
      local_540._20_4_ = uVar135;
      local_540._24_4_ = uVar135;
      local_540._28_4_ = uVar135;
      auVar90 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x484);
      auVar138._8_4_ = 1;
      auVar138._0_8_ = 0x100000001;
      auVar138._12_4_ = 1;
      auVar138._16_4_ = 1;
      auVar138._20_4_ = 1;
      auVar138._24_4_ = 1;
      auVar138._28_4_ = 1;
      local_500 = vpermps_avx2(auVar138,ZEXT1632(auVar6));
      local_560 = vbroadcastss_avx512vl(auVar197);
      local_580 = vpermps_avx2(auVar138,ZEXT1632(auVar197));
      auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x908);
      local_6c0 = vbroadcastss_avx512vl(auVar83);
      local_660 = vpermps_avx512vl(auVar138,ZEXT1632(auVar83));
      auVar199 = ZEXT3264(local_660);
      auVar92 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0xd8c);
      local_620 = vbroadcastss_avx512vl(auVar7);
      auVar202 = ZEXT3264(local_620);
      local_640 = vpermps_avx512vl(auVar138,ZEXT1632(auVar7));
      auVar201 = ZEXT3264(local_640);
      auVar94 = vmulps_avx512vl(local_620,auVar92);
      auVar95 = vmulps_avx512vl(local_640,auVar92);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_6c0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_660);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_560);
      auVar81 = vfmadd231ps_fma(auVar95,auVar90,local_580);
      auVar96 = vfmadd231ps_avx512vl(auVar94,auVar93,local_540);
      auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26);
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x484);
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x908);
      auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar93,local_500);
      auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0xd8c);
      auVar97 = vmulps_avx512vl(local_620,auVar101);
      auVar98 = vmulps_avx512vl(local_640,auVar101);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_6c0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,local_660);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,local_560);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_580);
      auVar8 = vfmadd231ps_fma(auVar97,auVar94,local_540);
      auVar9 = vfmadd231ps_fma(auVar98,auVar94,local_500);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar8),auVar96);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar9),auVar89);
      auVar97 = vmulps_avx512vl(auVar89,auVar98);
      auVar87 = vmulps_avx512vl(auVar96,auVar99);
      auVar97 = vsubps_avx512vl(auVar97,auVar87);
      auVar81 = vshufps_avx(local_670,local_670,0xff);
      uVar140 = auVar81._0_8_;
      local_a0._8_8_ = uVar140;
      local_a0._0_8_ = uVar140;
      local_a0._16_8_ = uVar140;
      local_a0._24_8_ = uVar140;
      auVar81 = vshufps_avx(local_680,local_680,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar81);
      auVar81 = vshufps_avx512vl(local_690,local_690,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar81);
      auVar81 = vshufps_avx512vl(_local_4d0,_local_4d0,0xff);
      uVar140 = auVar81._0_8_;
      register0x000012c8 = uVar140;
      local_100 = uVar140;
      register0x000012d0 = uVar140;
      register0x000012d8 = uVar140;
      auVar87 = vmulps_avx512vl(_local_100,auVar92);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,local_e0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,local_c0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar93,local_a0);
      auVar88 = vmulps_avx512vl(_local_100,auVar101);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_e0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar95,local_c0);
      auVar10 = vfmadd231ps_fma(auVar88,auVar94,local_a0);
      auVar88 = vmulps_avx512vl(auVar99,auVar99);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar98,auVar98);
      auVar100 = vmaxps_avx512vl(auVar87,ZEXT1632(auVar10));
      auVar100 = vmulps_avx512vl(auVar100,auVar100);
      auVar88 = vmulps_avx512vl(auVar100,auVar88);
      auVar97 = vmulps_avx512vl(auVar97,auVar97);
      uVar140 = vcmpps_avx512vl(auVar97,auVar88,2);
      auVar81 = vblendps_avx(auVar6,local_670,8);
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar82 = vandps_avx512vl(auVar81,auVar84);
      auVar81 = vblendps_avx(auVar197,local_680,8);
      auVar81 = vandps_avx512vl(auVar81,auVar84);
      auVar82 = vmaxps_avx(auVar82,auVar81);
      auVar81 = vblendps_avx(auVar83,local_690,8);
      auVar85 = vandps_avx512vl(auVar81,auVar84);
      auVar81 = vblendps_avx(auVar7,_local_4d0,8);
      auVar81 = vandps_avx512vl(auVar81,auVar84);
      auVar81 = vmaxps_avx(auVar85,auVar81);
      auVar81 = vmaxps_avx(auVar82,auVar81);
      auVar82 = vmovshdup_avx(auVar81);
      auVar82 = vmaxss_avx(auVar82,auVar81);
      auVar81 = vshufpd_avx(auVar81,auVar81,1);
      auVar81 = vmaxss_avx(auVar81,auVar82);
      auVar82 = vcvtsi2ss_avx512f(local_690,iVar13);
      local_460._0_16_ = auVar82;
      auVar176._0_4_ = auVar82._0_4_;
      auVar176._4_4_ = auVar176._0_4_;
      auVar176._8_4_ = auVar176._0_4_;
      auVar176._12_4_ = auVar176._0_4_;
      auVar176._16_4_ = auVar176._0_4_;
      auVar176._20_4_ = auVar176._0_4_;
      auVar176._24_4_ = auVar176._0_4_;
      auVar176._28_4_ = auVar176._0_4_;
      uVar25 = vcmpps_avx512vl(auVar176,_DAT_01faff40,0xe);
      bVar78 = (byte)uVar140 & (byte)uVar25;
      auVar81 = vmulss_avx512f(auVar81,ZEXT416(0x35000000));
      auVar149._8_4_ = 2;
      auVar149._0_8_ = 0x200000002;
      auVar149._12_4_ = 2;
      auVar149._16_4_ = 2;
      auVar149._20_4_ = 2;
      auVar149._24_4_ = 2;
      auVar149._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar149,ZEXT1632(auVar6));
      local_140 = vpermps_avx512vl(auVar149,ZEXT1632(auVar197));
      local_160 = vpermps_avx512vl(auVar149,ZEXT1632(auVar83));
      auVar97 = vpermps_avx2(auVar149,ZEXT1632(auVar7));
      uVar76 = *(uint *)(ray + k * 4 + 0x60);
      local_400 = auVar81._0_4_;
      uStack_3fc = auVar81._4_4_;
      uStack_3f8 = auVar81._8_4_;
      uStack_3f4 = auVar81._12_4_;
      auVar82 = auVar99._0_16_;
      if (bVar78 == 0) {
        uVar74 = 0;
        auVar81 = vxorps_avx512vl(auVar82,auVar82);
        auVar198 = ZEXT1664(auVar81);
        auVar194 = ZEXT3264(local_540);
        auVar195 = ZEXT3264(local_500);
        auVar196 = ZEXT3264(local_560);
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar200 = ZEXT3264(auVar93);
        auVar193 = ZEXT3264(local_580);
        auVar192 = ZEXT3264(local_6c0);
      }
      else {
        local_5c0._0_16_ = ZEXT416(uVar76);
        auVar101 = vmulps_avx512vl(auVar97,auVar101);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_160,auVar101);
        auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar102);
        auVar95 = vfmadd213ps_avx512vl(auVar94,local_120,auVar95);
        auVar92 = vmulps_avx512vl(auVar97,auVar92);
        auVar91 = vfmadd213ps_avx512vl(auVar91,local_160,auVar92);
        auVar102 = vfmadd213ps_avx512vl(auVar90,local_140,auVar91);
        auVar90 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1694);
        auVar92 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1b18);
        auVar94 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1f9c);
        auVar102 = vfmadd213ps_avx512vl(auVar93,local_120,auVar102);
        auVar93 = vmulps_avx512vl(local_620,auVar94);
        auVar101 = vmulps_avx512vl(local_640,auVar94);
        auVar182._0_4_ = auVar97._0_4_ * auVar94._0_4_;
        auVar182._4_4_ = auVar97._4_4_ * auVar94._4_4_;
        auVar182._8_4_ = auVar97._8_4_ * auVar94._8_4_;
        auVar182._12_4_ = auVar97._12_4_ * auVar94._12_4_;
        auVar182._16_4_ = auVar97._16_4_ * auVar94._16_4_;
        auVar182._20_4_ = auVar97._20_4_ * auVar94._20_4_;
        auVar182._24_4_ = auVar97._24_4_ * auVar94._24_4_;
        auVar182._28_4_ = 0;
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar92,local_6c0);
        auVar94 = vfmadd231ps_avx512vl(auVar101,auVar92,local_660);
        auVar92 = vfmadd231ps_avx512vl(auVar182,local_160,auVar92);
        auVar83 = vfmadd231ps_fma(auVar93,auVar91,local_560);
        auVar193 = ZEXT3264(local_580);
        auVar93 = vfmadd231ps_avx512vl(auVar94,auVar91,local_580);
        auVar94 = vfmadd231ps_avx512vl(auVar92,local_140,auVar91);
        auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar90,local_540);
        auVar88 = vfmadd231ps_avx512vl(auVar93,auVar90,local_500);
        auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1f9c);
        auVar94 = vfmadd231ps_avx512vl(auVar94,local_120,auVar90);
        auVar90 = vmulps_avx512vl(local_620,auVar92);
        auVar100 = vmulps_avx512vl(local_640,auVar92);
        auVar32._4_4_ = auVar97._4_4_ * auVar92._4_4_;
        auVar32._0_4_ = auVar97._0_4_ * auVar92._0_4_;
        auVar32._8_4_ = auVar97._8_4_ * auVar92._8_4_;
        auVar32._12_4_ = auVar97._12_4_ * auVar92._12_4_;
        auVar32._16_4_ = auVar97._16_4_ * auVar92._16_4_;
        auVar32._20_4_ = auVar97._20_4_ * auVar92._20_4_;
        auVar32._24_4_ = auVar97._24_4_ * auVar92._24_4_;
        auVar32._28_4_ = auVar92._28_4_;
        auVar92 = vfmadd231ps_avx512vl(auVar90,auVar91,local_6c0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar91,local_660);
        auVar91 = vfmadd231ps_avx512vl(auVar32,local_160,auVar91);
        auVar90 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1694);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar90,local_560);
        auVar196 = ZEXT3264(local_560);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar90,local_580);
        auVar90 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar93,local_540);
        auVar92 = vfmadd231ps_avx512vl(auVar100,auVar93,local_500);
        auVar100 = vfmadd231ps_avx512vl(auVar90,local_120,auVar93);
        auVar189._8_4_ = 0x7fffffff;
        auVar189._0_8_ = 0x7fffffff7fffffff;
        auVar189._12_4_ = 0x7fffffff;
        auVar189._16_4_ = 0x7fffffff;
        auVar189._20_4_ = 0x7fffffff;
        auVar189._24_4_ = 0x7fffffff;
        auVar189._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(auVar101,auVar189);
        auVar90 = vandps_avx(auVar88,auVar189);
        auVar90 = vmaxps_avx(auVar93,auVar90);
        auVar93 = vandps_avx(auVar94,auVar189);
        auVar93 = vmaxps_avx(auVar90,auVar93);
        auVar94 = vbroadcastss_avx512vl(auVar81);
        uVar70 = vcmpps_avx512vl(auVar93,auVar94,1);
        bVar17 = (bool)((byte)uVar70 & 1);
        auVar103._0_4_ = (float)((uint)bVar17 * auVar98._0_4_ | (uint)!bVar17 * auVar101._0_4_);
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar17 * auVar98._4_4_ | (uint)!bVar17 * auVar101._4_4_);
        bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar17 * auVar98._8_4_ | (uint)!bVar17 * auVar101._8_4_);
        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar17 * auVar98._12_4_ | (uint)!bVar17 * auVar101._12_4_);
        bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar17 * auVar98._16_4_ | (uint)!bVar17 * auVar101._16_4_);
        bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar17 * auVar98._20_4_ | (uint)!bVar17 * auVar101._20_4_);
        bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar17 * auVar98._24_4_ | (uint)!bVar17 * auVar101._24_4_);
        bVar17 = SUB81(uVar70 >> 7,0);
        auVar103._28_4_ = (uint)bVar17 * auVar98._28_4_ | (uint)!bVar17 * auVar101._28_4_;
        bVar17 = (bool)((byte)uVar70 & 1);
        auVar104._0_4_ = (float)((uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar88._0_4_);
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar88._4_4_);
        bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar88._8_4_);
        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar88._12_4_);
        bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar88._16_4_);
        bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar88._20_4_);
        bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar88._24_4_);
        bVar17 = SUB81(uVar70 >> 7,0);
        auVar104._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar88._28_4_;
        auVar93 = vandps_avx(auVar189,auVar91);
        auVar90 = vandps_avx(auVar92,auVar189);
        auVar90 = vmaxps_avx(auVar93,auVar90);
        auVar93 = vandps_avx(auVar100,auVar189);
        auVar93 = vmaxps_avx(auVar90,auVar93);
        uVar70 = vcmpps_avx512vl(auVar93,auVar94,1);
        bVar17 = (bool)((byte)uVar70 & 1);
        auVar105._0_4_ = (float)((uint)bVar17 * auVar98._0_4_ | (uint)!bVar17 * auVar91._0_4_);
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar17 * auVar98._4_4_ | (uint)!bVar17 * auVar91._4_4_);
        bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar17 * auVar98._8_4_ | (uint)!bVar17 * auVar91._8_4_);
        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar17 * auVar98._12_4_ | (uint)!bVar17 * auVar91._12_4_);
        bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar17 * auVar98._16_4_ | (uint)!bVar17 * auVar91._16_4_);
        bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar17 * auVar98._20_4_ | (uint)!bVar17 * auVar91._20_4_);
        bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar17 * auVar98._24_4_ | (uint)!bVar17 * auVar91._24_4_);
        bVar17 = SUB81(uVar70 >> 7,0);
        auVar105._28_4_ = (uint)bVar17 * auVar98._28_4_ | (uint)!bVar17 * auVar91._28_4_;
        bVar17 = (bool)((byte)uVar70 & 1);
        auVar106._0_4_ = (float)((uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar92._0_4_);
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar92._4_4_);
        bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar92._8_4_);
        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar92._12_4_);
        bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar92._16_4_);
        bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar92._20_4_);
        bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar92._24_4_);
        bVar17 = SUB81(uVar70 >> 7,0);
        auVar106._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar92._28_4_;
        auVar86 = vxorps_avx512vl(auVar82,auVar82);
        auVar198 = ZEXT1664(auVar86);
        auVar93 = vfmadd213ps_avx512vl(auVar103,auVar103,ZEXT1632(auVar86));
        auVar81 = vfmadd231ps_fma(auVar93,auVar104,auVar104);
        auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
        fVar151 = auVar93._0_4_;
        fVar133 = auVar93._4_4_;
        fVar134 = auVar93._8_4_;
        fVar139 = auVar93._12_4_;
        fVar169 = auVar93._16_4_;
        fVar171 = auVar93._20_4_;
        fVar79 = auVar93._24_4_;
        auVar33._4_4_ = fVar133 * fVar133 * fVar133 * auVar81._4_4_ * -0.5;
        auVar33._0_4_ = fVar151 * fVar151 * fVar151 * auVar81._0_4_ * -0.5;
        auVar33._8_4_ = fVar134 * fVar134 * fVar134 * auVar81._8_4_ * -0.5;
        auVar33._12_4_ = fVar139 * fVar139 * fVar139 * auVar81._12_4_ * -0.5;
        auVar33._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar33._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar33._24_4_ = fVar79 * fVar79 * fVar79 * -0.0;
        auVar33._28_4_ = auVar100._28_4_;
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar93 = vfmadd231ps_avx512vl(auVar33,auVar90,auVar93);
        auVar34._4_4_ = auVar104._4_4_ * auVar93._4_4_;
        auVar34._0_4_ = auVar104._0_4_ * auVar93._0_4_;
        auVar34._8_4_ = auVar104._8_4_ * auVar93._8_4_;
        auVar34._12_4_ = auVar104._12_4_ * auVar93._12_4_;
        auVar34._16_4_ = auVar104._16_4_ * auVar93._16_4_;
        auVar34._20_4_ = auVar104._20_4_ * auVar93._20_4_;
        auVar34._24_4_ = auVar104._24_4_ * auVar93._24_4_;
        auVar34._28_4_ = 0;
        auVar35._4_4_ = auVar93._4_4_ * -auVar103._4_4_;
        auVar35._0_4_ = auVar93._0_4_ * -auVar103._0_4_;
        auVar35._8_4_ = auVar93._8_4_ * -auVar103._8_4_;
        auVar35._12_4_ = auVar93._12_4_ * -auVar103._12_4_;
        auVar35._16_4_ = auVar93._16_4_ * -auVar103._16_4_;
        auVar35._20_4_ = auVar93._20_4_ * -auVar103._20_4_;
        auVar35._24_4_ = auVar93._24_4_ * -auVar103._24_4_;
        auVar35._28_4_ = auVar104._28_4_;
        auVar93 = vmulps_avx512vl(auVar93,ZEXT1632(auVar86));
        auVar98 = ZEXT1632(auVar86);
        auVar91 = vfmadd213ps_avx512vl(auVar105,auVar105,auVar98);
        auVar81 = vfmadd231ps_fma(auVar91,auVar106,auVar106);
        auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
        fVar151 = auVar91._0_4_;
        fVar133 = auVar91._4_4_;
        fVar134 = auVar91._8_4_;
        fVar139 = auVar91._12_4_;
        fVar169 = auVar91._16_4_;
        fVar171 = auVar91._20_4_;
        fVar79 = auVar91._24_4_;
        auVar36._4_4_ = fVar133 * fVar133 * fVar133 * auVar81._4_4_ * -0.5;
        auVar36._0_4_ = fVar151 * fVar151 * fVar151 * auVar81._0_4_ * -0.5;
        auVar36._8_4_ = fVar134 * fVar134 * fVar134 * auVar81._8_4_ * -0.5;
        auVar36._12_4_ = fVar139 * fVar139 * fVar139 * auVar81._12_4_ * -0.5;
        auVar36._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar36._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar36._24_4_ = fVar79 * fVar79 * fVar79 * -0.0;
        auVar36._28_4_ = 0;
        auVar90 = vfmadd231ps_avx512vl(auVar36,auVar90,auVar91);
        auVar37._4_4_ = auVar106._4_4_ * auVar90._4_4_;
        auVar37._0_4_ = auVar106._0_4_ * auVar90._0_4_;
        auVar37._8_4_ = auVar106._8_4_ * auVar90._8_4_;
        auVar37._12_4_ = auVar106._12_4_ * auVar90._12_4_;
        auVar37._16_4_ = auVar106._16_4_ * auVar90._16_4_;
        auVar37._20_4_ = auVar106._20_4_ * auVar90._20_4_;
        auVar37._24_4_ = auVar106._24_4_ * auVar90._24_4_;
        auVar37._28_4_ = auVar91._28_4_;
        auVar38._4_4_ = -auVar105._4_4_ * auVar90._4_4_;
        auVar38._0_4_ = -auVar105._0_4_ * auVar90._0_4_;
        auVar38._8_4_ = -auVar105._8_4_ * auVar90._8_4_;
        auVar38._12_4_ = -auVar105._12_4_ * auVar90._12_4_;
        auVar38._16_4_ = -auVar105._16_4_ * auVar90._16_4_;
        auVar38._20_4_ = -auVar105._20_4_ * auVar90._20_4_;
        auVar38._24_4_ = -auVar105._24_4_ * auVar90._24_4_;
        auVar38._28_4_ = auVar105._28_4_ ^ 0x80000000;
        auVar90 = vmulps_avx512vl(auVar90,auVar98);
        auVar81 = vfmadd213ps_fma(auVar34,auVar87,auVar96);
        auVar82 = vfmadd213ps_fma(auVar35,auVar87,auVar89);
        auVar91 = vfmadd213ps_avx512vl(auVar93,auVar87,auVar102);
        auVar92 = vfmadd213ps_avx512vl(auVar37,ZEXT1632(auVar10),ZEXT1632(auVar8));
        auVar84 = vfnmadd213ps_fma(auVar34,auVar87,auVar96);
        auVar101 = ZEXT1632(auVar10);
        auVar83 = vfmadd213ps_fma(auVar38,auVar101,ZEXT1632(auVar9));
        auVar85 = vfnmadd213ps_fma(auVar35,auVar87,auVar89);
        auVar6 = vfmadd213ps_fma(auVar90,auVar101,auVar95);
        auVar94 = vfnmadd231ps_avx512vl(auVar102,auVar87,auVar93);
        auVar8 = vfnmadd213ps_fma(auVar37,auVar101,ZEXT1632(auVar8));
        auVar9 = vfnmadd213ps_fma(auVar38,auVar101,ZEXT1632(auVar9));
        auVar141 = vfnmadd231ps_fma(auVar95,ZEXT1632(auVar10),auVar90);
        auVar90 = vsubps_avx512vl(auVar92,ZEXT1632(auVar84));
        auVar93 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar85));
        auVar95 = vsubps_avx512vl(ZEXT1632(auVar6),auVar94);
        auVar102 = vmulps_avx512vl(auVar93,auVar94);
        auVar197 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar85),auVar95);
        auVar39._4_4_ = auVar84._4_4_ * auVar95._4_4_;
        auVar39._0_4_ = auVar84._0_4_ * auVar95._0_4_;
        auVar39._8_4_ = auVar84._8_4_ * auVar95._8_4_;
        auVar39._12_4_ = auVar84._12_4_ * auVar95._12_4_;
        auVar39._16_4_ = auVar95._16_4_ * 0.0;
        auVar39._20_4_ = auVar95._20_4_ * 0.0;
        auVar39._24_4_ = auVar95._24_4_ * 0.0;
        auVar39._28_4_ = auVar95._28_4_;
        auVar95 = vfmsub231ps_avx512vl(auVar39,auVar94,auVar90);
        auVar40._4_4_ = auVar85._4_4_ * auVar90._4_4_;
        auVar40._0_4_ = auVar85._0_4_ * auVar90._0_4_;
        auVar40._8_4_ = auVar85._8_4_ * auVar90._8_4_;
        auVar40._12_4_ = auVar85._12_4_ * auVar90._12_4_;
        auVar40._16_4_ = auVar90._16_4_ * 0.0;
        auVar40._20_4_ = auVar90._20_4_ * 0.0;
        auVar40._24_4_ = auVar90._24_4_ * 0.0;
        auVar40._28_4_ = auVar90._28_4_;
        auVar7 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar84),auVar93);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar98,auVar95);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar197));
        auVar99 = ZEXT1632(auVar86);
        uVar70 = vcmpps_avx512vl(auVar93,auVar99,2);
        bVar69 = (byte)uVar70;
        fVar79 = (float)((uint)(bVar69 & 1) * auVar81._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar8._0_4_);
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar125 = (float)((uint)bVar17 * auVar81._4_4_ | (uint)!bVar17 * auVar8._4_4_);
        bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar126 = (float)((uint)bVar17 * auVar81._8_4_ | (uint)!bVar17 * auVar8._8_4_);
        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar129 = (float)((uint)bVar17 * auVar81._12_4_ | (uint)!bVar17 * auVar8._12_4_);
        auVar102 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar126,CONCAT44(fVar125,fVar79))));
        fVar80 = (float)((uint)(bVar69 & 1) * auVar82._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar9._0_4_);
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        fVar150 = (float)((uint)bVar17 * auVar82._4_4_ | (uint)!bVar17 * auVar9._4_4_);
        bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
        fVar127 = (float)((uint)bVar17 * auVar82._8_4_ | (uint)!bVar17 * auVar9._8_4_);
        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
        fVar130 = (float)((uint)bVar17 * auVar82._12_4_ | (uint)!bVar17 * auVar9._12_4_);
        auVar101 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar127,CONCAT44(fVar150,fVar80))));
        auVar107._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar141._0_4_
                    );
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar17 * auVar91._4_4_ | (uint)!bVar17 * auVar141._4_4_);
        bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar17 * auVar91._8_4_ | (uint)!bVar17 * auVar141._8_4_);
        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar17 * auVar91._12_4_ | (uint)!bVar17 * auVar141._12_4_);
        fVar151 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar91._16_4_);
        auVar107._16_4_ = fVar151;
        fVar133 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar91._20_4_);
        auVar107._20_4_ = fVar133;
        fVar134 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar91._24_4_);
        auVar107._24_4_ = fVar134;
        iVar1 = (uint)(byte)(uVar70 >> 7) * auVar91._28_4_;
        auVar107._28_4_ = iVar1;
        auVar90 = vblendmps_avx512vl(ZEXT1632(auVar84),auVar92);
        auVar108._0_4_ =
             (uint)(bVar69 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar197._0_4_;
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar17 * auVar90._4_4_ | (uint)!bVar17 * auVar197._4_4_;
        bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar17 * auVar90._8_4_ | (uint)!bVar17 * auVar197._8_4_;
        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar17 * auVar90._12_4_ | (uint)!bVar17 * auVar197._12_4_;
        auVar108._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar90._16_4_;
        auVar108._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar90._20_4_;
        auVar108._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar90._24_4_;
        auVar108._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar90._28_4_;
        auVar90 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar83));
        auVar109._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar82._0_4_)
        ;
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar17 * auVar90._4_4_ | (uint)!bVar17 * auVar82._4_4_);
        bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar17 * auVar90._8_4_ | (uint)!bVar17 * auVar82._8_4_);
        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar17 * auVar90._12_4_ | (uint)!bVar17 * auVar82._12_4_);
        fVar139 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar90._16_4_);
        auVar109._16_4_ = fVar139;
        fVar169 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar90._20_4_);
        auVar109._20_4_ = fVar169;
        fVar171 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar90._24_4_);
        auVar109._24_4_ = fVar171;
        auVar109._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar90._28_4_;
        auVar90 = vblendmps_avx512vl(auVar94,ZEXT1632(auVar6));
        auVar110._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar91._0_4_)
        ;
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar17 * auVar90._4_4_ | (uint)!bVar17 * auVar91._4_4_);
        bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar17 * auVar90._8_4_ | (uint)!bVar17 * auVar91._8_4_);
        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar17 * auVar90._12_4_ | (uint)!bVar17 * auVar91._12_4_);
        bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar17 * auVar90._16_4_ | (uint)!bVar17 * auVar91._16_4_);
        bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar17 * auVar90._20_4_ | (uint)!bVar17 * auVar91._20_4_);
        bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar17 * auVar90._24_4_ | (uint)!bVar17 * auVar91._24_4_);
        bVar17 = SUB81(uVar70 >> 7,0);
        auVar110._28_4_ = (uint)bVar17 * auVar90._28_4_ | (uint)!bVar17 * auVar91._28_4_;
        auVar111._0_4_ =
             (uint)(bVar69 & 1) * (int)auVar84._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar92._0_4_;
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar17 * (int)auVar84._4_4_ | (uint)!bVar17 * auVar92._4_4_;
        bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar17 * (int)auVar84._8_4_ | (uint)!bVar17 * auVar92._8_4_;
        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar17 * (int)auVar84._12_4_ | (uint)!bVar17 * auVar92._12_4_;
        auVar111._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar92._16_4_;
        auVar111._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar92._20_4_;
        auVar111._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar92._24_4_;
        auVar111._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar92._28_4_;
        bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar70 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar112._0_4_ =
             (uint)(bVar69 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar6._0_4_;
        bVar18 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar18 * auVar94._4_4_ | (uint)!bVar18 * auVar6._4_4_;
        bVar18 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar18 * auVar94._8_4_ | (uint)!bVar18 * auVar6._8_4_;
        bVar18 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar18 * auVar94._12_4_ | (uint)!bVar18 * auVar6._12_4_;
        auVar112._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar94._16_4_;
        auVar112._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar94._20_4_;
        auVar112._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar94._24_4_;
        iVar2 = (uint)(byte)(uVar70 >> 7) * auVar94._28_4_;
        auVar112._28_4_ = iVar2;
        auVar96 = vsubps_avx512vl(auVar111,auVar102);
        auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar85._12_4_ |
                                                (uint)!bVar20 * auVar83._12_4_,
                                                CONCAT48((uint)bVar19 * (int)auVar85._8_4_ |
                                                         (uint)!bVar19 * auVar83._8_4_,
                                                         CONCAT44((uint)bVar17 * (int)auVar85._4_4_
                                                                  | (uint)!bVar17 * auVar83._4_4_,
                                                                  (uint)(bVar69 & 1) *
                                                                  (int)auVar85._0_4_ |
                                                                  (uint)!(bool)(bVar69 & 1) *
                                                                  auVar83._0_4_)))),auVar101);
        auVar91 = vsubps_avx(auVar112,auVar107);
        auVar92 = vsubps_avx(auVar102,auVar108);
        auVar94 = vsubps_avx(auVar101,auVar109);
        auVar95 = vsubps_avx(auVar107,auVar110);
        auVar41._4_4_ = auVar91._4_4_ * fVar125;
        auVar41._0_4_ = auVar91._0_4_ * fVar79;
        auVar41._8_4_ = auVar91._8_4_ * fVar126;
        auVar41._12_4_ = auVar91._12_4_ * fVar129;
        auVar41._16_4_ = auVar91._16_4_ * 0.0;
        auVar41._20_4_ = auVar91._20_4_ * 0.0;
        auVar41._24_4_ = auVar91._24_4_ * 0.0;
        auVar41._28_4_ = iVar2;
        auVar81 = vfmsub231ps_fma(auVar41,auVar107,auVar96);
        auVar42._4_4_ = fVar150 * auVar96._4_4_;
        auVar42._0_4_ = fVar80 * auVar96._0_4_;
        auVar42._8_4_ = fVar127 * auVar96._8_4_;
        auVar42._12_4_ = fVar130 * auVar96._12_4_;
        auVar42._16_4_ = auVar96._16_4_ * 0.0;
        auVar42._20_4_ = auVar96._20_4_ * 0.0;
        auVar42._24_4_ = auVar96._24_4_ * 0.0;
        auVar42._28_4_ = auVar93._28_4_;
        auVar82 = vfmsub231ps_fma(auVar42,auVar102,auVar90);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar99,ZEXT1632(auVar81));
        auVar158._0_4_ = auVar90._0_4_ * auVar107._0_4_;
        auVar158._4_4_ = auVar90._4_4_ * auVar107._4_4_;
        auVar158._8_4_ = auVar90._8_4_ * auVar107._8_4_;
        auVar158._12_4_ = auVar90._12_4_ * auVar107._12_4_;
        auVar158._16_4_ = auVar90._16_4_ * fVar151;
        auVar158._20_4_ = auVar90._20_4_ * fVar133;
        auVar158._24_4_ = auVar90._24_4_ * fVar134;
        auVar158._28_4_ = 0;
        auVar81 = vfmsub231ps_fma(auVar158,auVar101,auVar91);
        auVar89 = vfmadd231ps_avx512vl(auVar93,auVar99,ZEXT1632(auVar81));
        auVar93 = vmulps_avx512vl(auVar95,auVar108);
        auVar93 = vfmsub231ps_avx512vl(auVar93,auVar92,auVar110);
        auVar43._4_4_ = auVar94._4_4_ * auVar110._4_4_;
        auVar43._0_4_ = auVar94._0_4_ * auVar110._0_4_;
        auVar43._8_4_ = auVar94._8_4_ * auVar110._8_4_;
        auVar43._12_4_ = auVar94._12_4_ * auVar110._12_4_;
        auVar43._16_4_ = auVar94._16_4_ * auVar110._16_4_;
        auVar43._20_4_ = auVar94._20_4_ * auVar110._20_4_;
        auVar43._24_4_ = auVar94._24_4_ * auVar110._24_4_;
        auVar43._28_4_ = auVar110._28_4_;
        auVar81 = vfmsub231ps_fma(auVar43,auVar109,auVar95);
        auVar159._0_4_ = auVar109._0_4_ * auVar92._0_4_;
        auVar159._4_4_ = auVar109._4_4_ * auVar92._4_4_;
        auVar159._8_4_ = auVar109._8_4_ * auVar92._8_4_;
        auVar159._12_4_ = auVar109._12_4_ * auVar92._12_4_;
        auVar159._16_4_ = fVar139 * auVar92._16_4_;
        auVar159._20_4_ = fVar169 * auVar92._20_4_;
        auVar159._24_4_ = fVar171 * auVar92._24_4_;
        auVar159._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar159,auVar94,auVar108);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar99,auVar93);
        auVar98 = vfmadd231ps_avx512vl(auVar93,auVar99,ZEXT1632(auVar81));
        auVar93 = vmaxps_avx(auVar89,auVar98);
        uVar140 = vcmpps_avx512vl(auVar93,auVar99,2);
        bVar78 = bVar78 & (byte)uVar140;
        auVar194 = ZEXT3264(local_540);
        auVar195 = ZEXT3264(local_500);
        auVar192 = ZEXT3264(local_6c0);
        if (bVar78 == 0) {
          uVar74 = 0;
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar200 = ZEXT3264(auVar93);
          auVar199 = ZEXT3264(local_660);
          auVar202 = ZEXT3264(local_620);
          auVar201 = ZEXT3264(local_640);
        }
        else {
          uVar135 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar184._4_4_ = uVar135;
          auVar184._0_4_ = uVar135;
          auVar184._8_4_ = uVar135;
          auVar184._12_4_ = uVar135;
          auVar184._16_4_ = uVar135;
          auVar184._20_4_ = uVar135;
          auVar184._24_4_ = uVar135;
          auVar184._28_4_ = uVar135;
          auVar186 = ZEXT3264(auVar184);
          auVar44._4_4_ = auVar95._4_4_ * auVar90._4_4_;
          auVar44._0_4_ = auVar95._0_4_ * auVar90._0_4_;
          auVar44._8_4_ = auVar95._8_4_ * auVar90._8_4_;
          auVar44._12_4_ = auVar95._12_4_ * auVar90._12_4_;
          auVar44._16_4_ = auVar95._16_4_ * auVar90._16_4_;
          auVar44._20_4_ = auVar95._20_4_ * auVar90._20_4_;
          auVar44._24_4_ = auVar95._24_4_ * auVar90._24_4_;
          auVar44._28_4_ = auVar93._28_4_;
          auVar83 = vfmsub231ps_fma(auVar44,auVar94,auVar91);
          auVar45._4_4_ = auVar91._4_4_ * auVar92._4_4_;
          auVar45._0_4_ = auVar91._0_4_ * auVar92._0_4_;
          auVar45._8_4_ = auVar91._8_4_ * auVar92._8_4_;
          auVar45._12_4_ = auVar91._12_4_ * auVar92._12_4_;
          auVar45._16_4_ = auVar91._16_4_ * auVar92._16_4_;
          auVar45._20_4_ = auVar91._20_4_ * auVar92._20_4_;
          auVar45._24_4_ = auVar91._24_4_ * auVar92._24_4_;
          auVar45._28_4_ = auVar91._28_4_;
          auVar82 = vfmsub231ps_fma(auVar45,auVar96,auVar95);
          auVar46._4_4_ = auVar94._4_4_ * auVar96._4_4_;
          auVar46._0_4_ = auVar94._0_4_ * auVar96._0_4_;
          auVar46._8_4_ = auVar94._8_4_ * auVar96._8_4_;
          auVar46._12_4_ = auVar94._12_4_ * auVar96._12_4_;
          auVar46._16_4_ = auVar94._16_4_ * auVar96._16_4_;
          auVar46._20_4_ = auVar94._20_4_ * auVar96._20_4_;
          auVar46._24_4_ = auVar94._24_4_ * auVar96._24_4_;
          auVar46._28_4_ = auVar94._28_4_;
          auVar6 = vfmsub231ps_fma(auVar46,auVar92,auVar90);
          auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar6));
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar83),auVar99);
          auVar90 = vrcp14ps_avx512vl(auVar93);
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar200 = ZEXT3264(auVar91);
          auVar92 = vfnmadd213ps_avx512vl(auVar90,auVar93,auVar91);
          auVar81 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
          auVar47._4_4_ = auVar6._4_4_ * auVar107._4_4_;
          auVar47._0_4_ = auVar6._0_4_ * auVar107._0_4_;
          auVar47._8_4_ = auVar6._8_4_ * auVar107._8_4_;
          auVar47._12_4_ = auVar6._12_4_ * auVar107._12_4_;
          auVar47._16_4_ = fVar151 * 0.0;
          auVar47._20_4_ = fVar133 * 0.0;
          auVar47._24_4_ = fVar134 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar82 = vfmadd231ps_fma(auVar47,auVar101,ZEXT1632(auVar82));
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar102,ZEXT1632(auVar83));
          fVar151 = auVar81._0_4_;
          fVar133 = auVar81._4_4_;
          fVar134 = auVar81._8_4_;
          fVar139 = auVar81._12_4_;
          local_3a0 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar139,
                                         CONCAT48(auVar82._8_4_ * fVar134,
                                                  CONCAT44(auVar82._4_4_ * fVar133,
                                                           auVar82._0_4_ * fVar151))));
          auVar173._4_4_ = uVar76;
          auVar173._0_4_ = uVar76;
          auVar173._8_4_ = uVar76;
          auVar173._12_4_ = uVar76;
          auVar173._16_4_ = uVar76;
          auVar173._20_4_ = uVar76;
          auVar173._24_4_ = uVar76;
          auVar173._28_4_ = uVar76;
          uVar140 = vcmpps_avx512vl(local_3a0,auVar184,2);
          uVar25 = vcmpps_avx512vl(auVar173,local_3a0,2);
          bVar78 = (byte)uVar140 & (byte)uVar25 & bVar78;
          auVar202 = ZEXT3264(local_620);
          auVar201 = ZEXT3264(local_640);
          auVar191 = ZEXT3264(auVar97);
          if (bVar78 == 0) {
            uVar74 = 0;
            auVar199 = ZEXT3264(local_660);
          }
          else {
            uVar140 = vcmpps_avx512vl(auVar93,auVar99,4);
            bVar78 = bVar78 & (byte)uVar140;
            auVar199 = ZEXT3264(local_660);
            if (bVar78 != 0) {
              fVar169 = auVar89._0_4_ * fVar151;
              fVar171 = auVar89._4_4_ * fVar133;
              auVar48._4_4_ = fVar171;
              auVar48._0_4_ = fVar169;
              fVar79 = auVar89._8_4_ * fVar134;
              auVar48._8_4_ = fVar79;
              fVar80 = auVar89._12_4_ * fVar139;
              auVar48._12_4_ = fVar80;
              fVar125 = auVar89._16_4_ * 0.0;
              auVar48._16_4_ = fVar125;
              fVar150 = auVar89._20_4_ * 0.0;
              auVar48._20_4_ = fVar150;
              fVar126 = auVar89._24_4_ * 0.0;
              auVar48._24_4_ = fVar126;
              auVar48._28_4_ = auVar93._28_4_;
              auVar90 = vsubps_avx512vl(auVar91,auVar48);
              local_3e0._0_4_ =
                   (float)((uint)(bVar69 & 1) * (int)fVar169 |
                          (uint)!(bool)(bVar69 & 1) * auVar90._0_4_);
              bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
              local_3e0._4_4_ = (float)((uint)bVar17 * (int)fVar171 | (uint)!bVar17 * auVar90._4_4_)
              ;
              bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
              local_3e0._8_4_ = (float)((uint)bVar17 * (int)fVar79 | (uint)!bVar17 * auVar90._8_4_);
              bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
              local_3e0._12_4_ =
                   (float)((uint)bVar17 * (int)fVar80 | (uint)!bVar17 * auVar90._12_4_);
              bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
              local_3e0._16_4_ =
                   (float)((uint)bVar17 * (int)fVar125 | (uint)!bVar17 * auVar90._16_4_);
              bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
              local_3e0._20_4_ =
                   (float)((uint)bVar17 * (int)fVar150 | (uint)!bVar17 * auVar90._20_4_);
              bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
              local_3e0._24_4_ =
                   (float)((uint)bVar17 * (int)fVar126 | (uint)!bVar17 * auVar90._24_4_);
              bVar17 = SUB81(uVar70 >> 7,0);
              local_3e0._28_4_ =
                   (float)((uint)bVar17 * auVar93._28_4_ | (uint)!bVar17 * auVar90._28_4_);
              auVar93 = vsubps_avx(ZEXT1632(auVar10),auVar87);
              auVar81 = vfmadd213ps_fma(auVar93,local_3e0,auVar87);
              uVar135 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar27._4_4_ = uVar135;
              auVar27._0_4_ = uVar135;
              auVar27._8_4_ = uVar135;
              auVar27._12_4_ = uVar135;
              auVar27._16_4_ = uVar135;
              auVar27._20_4_ = uVar135;
              auVar27._24_4_ = uVar135;
              auVar27._28_4_ = uVar135;
              auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                           CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                    CONCAT44(auVar81._4_4_ +
                                                                             auVar81._4_4_,
                                                                             auVar81._0_4_ +
                                                                             auVar81._0_4_)))),
                                        auVar27);
              uVar140 = vcmpps_avx512vl(local_3a0,auVar93,6);
              if (((byte)uVar140 & bVar78) != 0) {
                auVar156._0_4_ = auVar98._0_4_ * fVar151;
                auVar156._4_4_ = auVar98._4_4_ * fVar133;
                auVar156._8_4_ = auVar98._8_4_ * fVar134;
                auVar156._12_4_ = auVar98._12_4_ * fVar139;
                auVar156._16_4_ = auVar98._16_4_ * 0.0;
                auVar156._20_4_ = auVar98._20_4_ * 0.0;
                auVar156._24_4_ = auVar98._24_4_ * 0.0;
                auVar156._28_4_ = 0;
                auVar93 = vsubps_avx512vl(auVar91,auVar156);
                auVar113._0_4_ =
                     (uint)(bVar69 & 1) * (int)auVar156._0_4_ |
                     (uint)!(bool)(bVar69 & 1) * auVar93._0_4_;
                bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
                auVar113._4_4_ = (uint)bVar17 * (int)auVar156._4_4_ | (uint)!bVar17 * auVar93._4_4_;
                bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
                auVar113._8_4_ = (uint)bVar17 * (int)auVar156._8_4_ | (uint)!bVar17 * auVar93._8_4_;
                bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
                auVar113._12_4_ =
                     (uint)bVar17 * (int)auVar156._12_4_ | (uint)!bVar17 * auVar93._12_4_;
                bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
                auVar113._16_4_ =
                     (uint)bVar17 * (int)auVar156._16_4_ | (uint)!bVar17 * auVar93._16_4_;
                bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
                auVar113._20_4_ =
                     (uint)bVar17 * (int)auVar156._20_4_ | (uint)!bVar17 * auVar93._20_4_;
                bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
                auVar113._24_4_ =
                     (uint)bVar17 * (int)auVar156._24_4_ | (uint)!bVar17 * auVar93._24_4_;
                auVar113._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar93._28_4_;
                auVar28._8_4_ = 0x40000000;
                auVar28._0_8_ = 0x4000000040000000;
                auVar28._12_4_ = 0x40000000;
                auVar28._16_4_ = 0x40000000;
                auVar28._20_4_ = 0x40000000;
                auVar28._24_4_ = 0x40000000;
                auVar28._28_4_ = 0x40000000;
                local_3c0 = vfmsub132ps_avx512vl(auVar113,auVar91,auVar28);
                local_380 = 0;
                local_370 = local_670._0_8_;
                uStack_368 = local_670._8_8_;
                local_360 = local_680._0_8_;
                uStack_358 = local_680._8_8_;
                local_350 = local_690._0_8_;
                uStack_348 = local_690._8_8_;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar74 = CONCAT71((int7)(uVar74 >> 8),1),
                     pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar151 = 1.0 / auVar176._0_4_;
                    local_320[0] = fVar151 * (local_3e0._0_4_ + 0.0);
                    local_320[1] = fVar151 * (local_3e0._4_4_ + 1.0);
                    local_320[2] = fVar151 * (local_3e0._8_4_ + 2.0);
                    local_320[3] = fVar151 * (local_3e0._12_4_ + 3.0);
                    fStack_310 = fVar151 * (local_3e0._16_4_ + 4.0);
                    fStack_30c = fVar151 * (local_3e0._20_4_ + 5.0);
                    fStack_308 = fVar151 * (local_3e0._24_4_ + 6.0);
                    fStack_304 = local_3e0._28_4_ + 7.0;
                    local_300 = local_3c0;
                    local_2e0 = local_3a0;
                    local_4a0 = 0;
                    uVar75 = (ulong)((byte)uVar140 & bVar78);
                    for (uVar70 = uVar75; (uVar70 & 1) == 0;
                        uVar70 = uVar70 >> 1 | 0x8000000000000000) {
                      local_4a0 = local_4a0 + 1;
                    }
                    local_420 = vpbroadcastd_avx512vl();
                    local_4c0 = vpbroadcastd_avx512vl();
                    local_5a0 = auVar97;
                    local_520 = auVar184;
                    local_37c = iVar13;
                    do {
                      auVar197 = auVar198._0_16_;
                      fVar151 = local_320[local_4a0];
                      auVar142._4_4_ = fVar151;
                      auVar142._0_4_ = fVar151;
                      auVar142._8_4_ = fVar151;
                      auVar142._12_4_ = fVar151;
                      local_220._16_4_ = fVar151;
                      local_220._0_16_ = auVar142;
                      local_220._20_4_ = fVar151;
                      local_220._24_4_ = fVar151;
                      local_220._28_4_ = fVar151;
                      local_200 = *(undefined4 *)(local_300 + local_4a0 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_2e0 + local_4a0 * 4);
                      local_6f0.context = context->user;
                      fVar133 = 1.0 - fVar151;
                      auVar6 = vfnmadd231ss_fma(ZEXT416((uint)(fVar151 * (fVar133 + fVar133))),
                                                ZEXT416((uint)fVar133),ZEXT416((uint)fVar133));
                      auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar142,
                                                ZEXT416(0xc0a00000));
                      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * 3.0)),
                                                ZEXT416((uint)(fVar151 + fVar151)),auVar81);
                      auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar142,
                                                ZEXT416(0x40000000));
                      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133 * -3.0)),
                                                ZEXT416((uint)(fVar133 + fVar133)),auVar81);
                      auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),auVar142,
                                                ZEXT416((uint)(fVar133 * -2.0)));
                      fVar151 = auVar6._0_4_ * 0.5;
                      fVar133 = auVar82._0_4_ * 0.5;
                      fVar134 = auVar81._0_4_ * 0.5;
                      fVar139 = auVar83._0_4_ * 0.5;
                      auVar152._0_4_ = fVar139 * (float)local_4d0._0_4_;
                      auVar152._4_4_ = fVar139 * (float)local_4d0._4_4_;
                      auVar152._8_4_ = fVar139 * fStack_4c8;
                      auVar152._12_4_ = fVar139 * fStack_4c4;
                      auVar164._4_4_ = fVar134;
                      auVar164._0_4_ = fVar134;
                      auVar164._8_4_ = fVar134;
                      auVar164._12_4_ = fVar134;
                      auVar81 = vfmadd132ps_fma(auVar164,auVar152,local_690);
                      auVar153._4_4_ = fVar133;
                      auVar153._0_4_ = fVar133;
                      auVar153._8_4_ = fVar133;
                      auVar153._12_4_ = fVar133;
                      auVar81 = vfmadd132ps_fma(auVar153,auVar81,local_680);
                      auVar136._4_4_ = fVar151;
                      auVar136._0_4_ = fVar151;
                      auVar136._8_4_ = fVar151;
                      auVar136._12_4_ = fVar151;
                      auVar81 = vfmadd132ps_fma(auVar136,auVar81,local_670);
                      local_280 = auVar81._0_4_;
                      auVar160._8_4_ = 1;
                      auVar160._0_8_ = 0x100000001;
                      auVar160._12_4_ = 1;
                      auVar160._16_4_ = 1;
                      auVar160._20_4_ = 1;
                      auVar160._24_4_ = 1;
                      auVar160._28_4_ = 1;
                      local_260 = vpermps_avx2(auVar160,ZEXT1632(auVar81));
                      auVar167._8_4_ = 2;
                      auVar167._0_8_ = 0x200000002;
                      auVar167._12_4_ = 2;
                      auVar167._16_4_ = 2;
                      auVar167._20_4_ = 2;
                      auVar167._24_4_ = 2;
                      auVar167._28_4_ = 2;
                      local_240 = vpermps_avx2(auVar167,ZEXT1632(auVar81));
                      uStack_27c = local_280;
                      uStack_278 = local_280;
                      uStack_274 = local_280;
                      uStack_270 = local_280;
                      uStack_26c = local_280;
                      uStack_268 = local_280;
                      uStack_264 = local_280;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_4c0._0_8_;
                      uStack_1d8 = local_4c0._8_8_;
                      uStack_1d0 = local_4c0._16_8_;
                      uStack_1c8 = local_4c0._24_8_;
                      local_1c0 = local_420;
                      vpcmpeqd_avx2(local_420,local_420);
                      local_1a0 = (local_6f0.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_6f0.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_600 = local_2a0;
                      local_6f0.valid = (int *)local_600;
                      local_6f0.geometryUserPtr = pGVar14->userPtr;
                      local_6f0.hit = (RTCHitN *)&local_280;
                      local_6f0.N = 8;
                      local_480 = (uint)uVar75;
                      uStack_47c = (uint)(uVar75 >> 0x20);
                      local_6f0.ray = (RTCRayN *)ray;
                      if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar14->occlusionFilterN)(&local_6f0);
                        uVar75 = CONCAT44(uStack_47c,local_480);
                        auVar186 = ZEXT3264(local_520);
                        auVar191 = ZEXT3264(local_5a0);
                        auVar201 = ZEXT3264(local_640);
                        auVar202 = ZEXT3264(local_620);
                        auVar199 = ZEXT3264(local_660);
                        auVar192 = ZEXT3264(local_6c0);
                        auVar193 = ZEXT3264(local_580);
                        auVar196 = ZEXT3264(local_560);
                        auVar195 = ZEXT3264(local_500);
                        auVar194 = ZEXT3264(local_540);
                        auVar81 = vxorps_avx512vl(auVar197,auVar197);
                        auVar198 = ZEXT1664(auVar81);
                        uVar76 = local_5c0._0_4_;
                      }
                      auVar81 = auVar198._0_16_;
                      if (local_600 == (undefined1  [32])0x0) {
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar200 = ZEXT3264(auVar93);
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if (p_Var16 == (RTCFilterFunctionN)0x0) {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar200 = ZEXT3264(auVar93);
                        }
                        else {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar200 = ZEXT3264(auVar93);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var16)(&local_6f0);
                            uVar75 = CONCAT44(uStack_47c,local_480);
                            auVar186 = ZEXT3264(local_520);
                            auVar191 = ZEXT3264(local_5a0);
                            auVar201 = ZEXT3264(local_640);
                            auVar202 = ZEXT3264(local_620);
                            auVar199 = ZEXT3264(local_660);
                            auVar192 = ZEXT3264(local_6c0);
                            auVar193 = ZEXT3264(local_580);
                            auVar196 = ZEXT3264(local_560);
                            auVar195 = ZEXT3264(local_500);
                            auVar194 = ZEXT3264(local_540);
                            auVar81 = vxorps_avx512vl(auVar81,auVar81);
                            auVar198 = ZEXT1664(auVar81);
                            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar200 = ZEXT3264(auVar93);
                            uVar76 = local_5c0._0_4_;
                          }
                        }
                        auVar97 = auVar191._0_32_;
                        uVar70 = vptestmd_avx512vl(local_600,local_600);
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar17 = (bool)((byte)uVar70 & 1);
                        bVar18 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                        bVar21 = (bool)((byte)(uVar70 >> 4) & 1);
                        bVar22 = (bool)((byte)(uVar70 >> 5) & 1);
                        bVar23 = (bool)((byte)(uVar70 >> 6) & 1);
                        bVar24 = SUB81(uVar70 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x100) =
                             (uint)bVar17 * auVar93._0_4_ |
                             (uint)!bVar17 * *(int *)(local_6f0.ray + 0x100);
                        *(uint *)(local_6f0.ray + 0x104) =
                             (uint)bVar18 * auVar93._4_4_ |
                             (uint)!bVar18 * *(int *)(local_6f0.ray + 0x104);
                        *(uint *)(local_6f0.ray + 0x108) =
                             (uint)bVar19 * auVar93._8_4_ |
                             (uint)!bVar19 * *(int *)(local_6f0.ray + 0x108);
                        *(uint *)(local_6f0.ray + 0x10c) =
                             (uint)bVar20 * auVar93._12_4_ |
                             (uint)!bVar20 * *(int *)(local_6f0.ray + 0x10c);
                        *(uint *)(local_6f0.ray + 0x110) =
                             (uint)bVar21 * auVar93._16_4_ |
                             (uint)!bVar21 * *(int *)(local_6f0.ray + 0x110);
                        *(uint *)(local_6f0.ray + 0x114) =
                             (uint)bVar22 * auVar93._20_4_ |
                             (uint)!bVar22 * *(int *)(local_6f0.ray + 0x114);
                        *(uint *)(local_6f0.ray + 0x118) =
                             (uint)bVar23 * auVar93._24_4_ |
                             (uint)!bVar23 * *(int *)(local_6f0.ray + 0x118);
                        *(uint *)(local_6f0.ray + 0x11c) =
                             (uint)bVar24 * auVar93._28_4_ |
                             (uint)!bVar24 * *(int *)(local_6f0.ray + 0x11c);
                        if (local_600 != (undefined1  [32])0x0) {
                          uVar74 = CONCAT71((int7)(uVar74 >> 8),1);
                          break;
                        }
                      }
                      auVar97 = auVar191._0_32_;
                      *(int *)(ray + k * 4 + 0x100) = auVar186._0_4_;
                      uVar70 = local_4a0 & 0x3f;
                      uVar74 = 0;
                      local_4a0 = 0;
                      uVar75 = uVar75 ^ 1L << uVar70;
                      for (uVar70 = uVar75; (uVar70 & 1) == 0;
                          uVar70 = uVar70 >> 1 | 0x8000000000000000) {
                        local_4a0 = local_4a0 + 1;
                      }
                    } while (uVar75 != 0);
                  }
                  goto LAB_01e8626d;
                }
              }
            }
            uVar74 = 0;
          }
        }
      }
LAB_01e8626d:
      if (8 < iVar13) {
        local_5c0 = vpbroadcastd_avx512vl();
        uStack_3fc = local_400;
        uStack_3f8 = local_400;
        uStack_3f4 = local_400;
        uStack_3f0 = local_400;
        uStack_3ec = local_400;
        uStack_3e8 = local_400;
        uStack_3e4 = local_400;
        fStack_498 = 1.0 / (float)local_460._0_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar77 = 8;
        local_5a0 = auVar97;
        fStack_494 = fStack_498;
        fStack_490 = fStack_498;
        fStack_48c = fStack_498;
        fStack_488 = fStack_498;
        fStack_484 = fStack_498;
        local_480 = uVar76;
        uStack_47c = uVar76;
        uStack_478 = uVar76;
        uStack_474 = uVar76;
        uStack_470 = uVar76;
        uStack_46c = uVar76;
        uStack_468 = uVar76;
        uStack_464 = uVar76;
        local_4a0._0_4_ = fStack_498;
        local_4a0._4_4_ = fStack_498;
        do {
          auVar93 = vpbroadcastd_avx512vl();
          auVar94 = vpor_avx2(auVar93,_DAT_01fe9900);
          uVar25 = vpcmpd_avx512vl(auVar94,local_5c0,1);
          auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar77 * 4 + lVar26);
          auVar90 = *(undefined1 (*) [32])(lVar26 + 0x21b37f0 + lVar77 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar26 + 0x21b3c74 + lVar77 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar26 + 0x21b40f8 + lVar77 * 4);
          local_620 = auVar202._0_32_;
          auVar95 = vmulps_avx512vl(local_620,auVar92);
          local_640 = auVar201._0_32_;
          auVar102 = vmulps_avx512vl(local_640,auVar92);
          auVar49._4_4_ = auVar92._4_4_ * (float)local_100._4_4_;
          auVar49._0_4_ = auVar92._0_4_ * (float)local_100._0_4_;
          auVar49._8_4_ = auVar92._8_4_ * fStack_f8;
          auVar49._12_4_ = auVar92._12_4_ * fStack_f4;
          auVar49._16_4_ = auVar92._16_4_ * fStack_f0;
          auVar49._20_4_ = auVar92._20_4_ * fStack_ec;
          auVar49._24_4_ = auVar92._24_4_ * fStack_e8;
          auVar49._28_4_ = auVar94._28_4_;
          auVar144 = auVar192._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar144);
          local_660 = auVar199._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar102,auVar91,local_660);
          auVar102 = vfmadd231ps_avx512vl(auVar49,auVar91,local_e0);
          auVar170 = auVar196._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar170);
          auVar148 = auVar193._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar148);
          auVar81 = vfmadd231ps_fma(auVar102,auVar90,local_c0);
          auVar166 = auVar194._0_32_;
          auVar89 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar166);
          local_500 = auVar195._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar95,auVar93,local_500);
          auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar77 * 4 + lVar26);
          auVar95 = *(undefined1 (*) [32])(lVar26 + 0x21b5c10 + lVar77 * 4);
          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar93,local_a0);
          auVar102 = *(undefined1 (*) [32])(lVar26 + 0x21b6094 + lVar77 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar26 + 0x21b6518 + lVar77 * 4);
          auVar97 = vmulps_avx512vl(local_620,auVar101);
          auVar96 = vmulps_avx512vl(local_640,auVar101);
          auVar50._4_4_ = auVar101._4_4_ * (float)local_100._4_4_;
          auVar50._0_4_ = auVar101._0_4_ * (float)local_100._0_4_;
          auVar50._8_4_ = auVar101._8_4_ * fStack_f8;
          auVar50._12_4_ = auVar101._12_4_ * fStack_f4;
          auVar50._16_4_ = auVar101._16_4_ * fStack_f0;
          auVar50._20_4_ = auVar101._20_4_ * fStack_ec;
          auVar50._24_4_ = auVar101._24_4_ * fStack_e8;
          auVar50._28_4_ = uStack_e4;
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,auVar144);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_660);
          auVar99 = vfmadd231ps_avx512vl(auVar50,auVar102,local_e0);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar170);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,auVar148);
          auVar82 = vfmadd231ps_fma(auVar99,auVar95,local_c0);
          auVar99 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar166);
          auVar87 = vfmadd231ps_avx512vl(auVar96,auVar94,local_500);
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar94,local_a0);
          auVar88 = vmaxps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar82));
          auVar97 = vsubps_avx(auVar99,auVar89);
          auVar96 = vsubps_avx(auVar87,auVar98);
          auVar100 = vmulps_avx512vl(auVar98,auVar97);
          auVar114 = vmulps_avx512vl(auVar89,auVar96);
          auVar100 = vsubps_avx512vl(auVar100,auVar114);
          auVar114 = vmulps_avx512vl(auVar96,auVar96);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar97,auVar97);
          auVar88 = vmulps_avx512vl(auVar88,auVar88);
          auVar88 = vmulps_avx512vl(auVar88,auVar114);
          auVar100 = vmulps_avx512vl(auVar100,auVar100);
          uVar140 = vcmpps_avx512vl(auVar100,auVar88,2);
          bVar78 = (byte)uVar25 & (byte)uVar140;
          if (bVar78 == 0) {
            auVar192 = ZEXT3264(auVar144);
          }
          else {
            auVar101 = vmulps_avx512vl(local_5a0,auVar101);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_160,auVar101);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar102);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_120,auVar95);
            auVar92 = vmulps_avx512vl(local_5a0,auVar92);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_160,auVar92);
            auVar90 = vfmadd213ps_avx512vl(auVar90,local_140,auVar91);
            auVar95 = vfmadd213ps_avx512vl(auVar93,local_120,auVar90);
            auVar93 = *(undefined1 (*) [32])(lVar26 + 0x21b457c + lVar77 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar26 + 0x21b4a00 + lVar77 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar26 + 0x21b4e84 + lVar77 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar26 + 0x21b5308 + lVar77 * 4);
            auVar102 = vmulps_avx512vl(local_620,auVar92);
            auVar101 = vmulps_avx512vl(local_640,auVar92);
            auVar92 = vmulps_avx512vl(local_5a0,auVar92);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar91,auVar144);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,local_660);
            auVar91 = vfmadd231ps_avx512vl(auVar92,local_160,auVar91);
            auVar92 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar170);
            auVar102 = vfmadd231ps_avx512vl(auVar101,auVar90,auVar148);
            auVar90 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar93,auVar166);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,local_500);
            auVar101 = vfmadd231ps_avx512vl(auVar90,local_120,auVar93);
            auVar93 = *(undefined1 (*) [32])(lVar26 + 0x21b699c + lVar77 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar26 + 0x21b72a4 + lVar77 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar26 + 0x21b7728 + lVar77 * 4);
            auVar88 = vmulps_avx512vl(local_620,auVar91);
            auVar100 = vmulps_avx512vl(local_640,auVar91);
            auVar91 = vmulps_avx512vl(local_5a0,auVar91);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar90,auVar144);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar90,local_660);
            auVar91 = vfmadd231ps_avx512vl(auVar91,local_160,auVar90);
            auVar90 = *(undefined1 (*) [32])(lVar26 + 0x21b6e20 + lVar77 * 4);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar90,auVar170);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar90,auVar148);
            auVar90 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
            auVar91 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar166);
            auVar88 = vfmadd231ps_avx512vl(auVar100,auVar93,local_500);
            auVar90 = vfmadd231ps_avx512vl(auVar90,local_120,auVar93);
            auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar92,auVar100);
            vandps_avx512vl(auVar102,auVar100);
            auVar93 = vmaxps_avx(auVar100,auVar100);
            vandps_avx512vl(auVar101,auVar100);
            auVar93 = vmaxps_avx(auVar93,auVar100);
            auVar68._4_4_ = uStack_3fc;
            auVar68._0_4_ = local_400;
            auVar68._8_4_ = uStack_3f8;
            auVar68._12_4_ = uStack_3f4;
            auVar68._16_4_ = uStack_3f0;
            auVar68._20_4_ = uStack_3ec;
            auVar68._24_4_ = uStack_3e8;
            auVar68._28_4_ = uStack_3e4;
            uVar70 = vcmpps_avx512vl(auVar93,auVar68,1);
            bVar17 = (bool)((byte)uVar70 & 1);
            auVar115._0_4_ = (float)((uint)bVar17 * auVar97._0_4_ | (uint)!bVar17 * auVar92._0_4_);
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar92._4_4_);
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar92._8_4_);
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar92._12_4_);
            bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar115._16_4_ =
                 (float)((uint)bVar17 * auVar97._16_4_ | (uint)!bVar17 * auVar92._16_4_);
            bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar115._20_4_ =
                 (float)((uint)bVar17 * auVar97._20_4_ | (uint)!bVar17 * auVar92._20_4_);
            bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar115._24_4_ =
                 (float)((uint)bVar17 * auVar97._24_4_ | (uint)!bVar17 * auVar92._24_4_);
            bVar17 = SUB81(uVar70 >> 7,0);
            auVar115._28_4_ = (uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar92._28_4_;
            bVar17 = (bool)((byte)uVar70 & 1);
            auVar116._0_4_ = (float)((uint)bVar17 * auVar96._0_4_ | (uint)!bVar17 * auVar102._0_4_);
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar102._4_4_);
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar102._8_4_);
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar102._12_4_);
            bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * auVar102._16_4_);
            bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * auVar102._20_4_);
            bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * auVar102._24_4_);
            bVar17 = SUB81(uVar70 >> 7,0);
            auVar116._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar102._28_4_;
            vandps_avx512vl(auVar91,auVar100);
            vandps_avx512vl(auVar88,auVar100);
            auVar93 = vmaxps_avx(auVar116,auVar116);
            vandps_avx512vl(auVar90,auVar100);
            auVar93 = vmaxps_avx(auVar93,auVar116);
            uVar70 = vcmpps_avx512vl(auVar93,auVar68,1);
            bVar17 = (bool)((byte)uVar70 & 1);
            auVar117._0_4_ = (uint)bVar17 * auVar97._0_4_ | (uint)!bVar17 * auVar91._0_4_;
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar117._4_4_ = (uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar91._4_4_;
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar117._8_4_ = (uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar91._8_4_;
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar117._12_4_ = (uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar91._12_4_;
            bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar117._16_4_ = (uint)bVar17 * auVar97._16_4_ | (uint)!bVar17 * auVar91._16_4_;
            bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar117._20_4_ = (uint)bVar17 * auVar97._20_4_ | (uint)!bVar17 * auVar91._20_4_;
            bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar117._24_4_ = (uint)bVar17 * auVar97._24_4_ | (uint)!bVar17 * auVar91._24_4_;
            bVar17 = SUB81(uVar70 >> 7,0);
            auVar117._28_4_ = (uint)bVar17 * auVar97._28_4_ | (uint)!bVar17 * auVar91._28_4_;
            bVar17 = (bool)((byte)uVar70 & 1);
            auVar118._0_4_ = (float)((uint)bVar17 * auVar96._0_4_ | (uint)!bVar17 * auVar88._0_4_);
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar88._4_4_);
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar88._8_4_);
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar88._12_4_);
            bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar118._16_4_ =
                 (float)((uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * auVar88._16_4_);
            bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar118._20_4_ =
                 (float)((uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * auVar88._20_4_);
            bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar118._24_4_ =
                 (float)((uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * auVar88._24_4_);
            bVar17 = SUB81(uVar70 >> 7,0);
            auVar118._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar88._28_4_;
            auVar178._8_4_ = 0x80000000;
            auVar178._0_8_ = 0x8000000080000000;
            auVar178._12_4_ = 0x80000000;
            auVar178._16_4_ = 0x80000000;
            auVar178._20_4_ = 0x80000000;
            auVar178._24_4_ = 0x80000000;
            auVar178._28_4_ = 0x80000000;
            auVar93 = vxorps_avx512vl(auVar117,auVar178);
            auVar88 = auVar198._0_32_;
            auVar90 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar88);
            auVar83 = vfmadd231ps_fma(auVar90,auVar116,auVar116);
            auVar90 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
            auVar190._8_4_ = 0xbf000000;
            auVar190._0_8_ = 0xbf000000bf000000;
            auVar190._12_4_ = 0xbf000000;
            auVar190._16_4_ = 0xbf000000;
            auVar190._20_4_ = 0xbf000000;
            auVar190._24_4_ = 0xbf000000;
            auVar190._28_4_ = 0xbf000000;
            fVar151 = auVar90._0_4_;
            fVar133 = auVar90._4_4_;
            fVar134 = auVar90._8_4_;
            fVar139 = auVar90._12_4_;
            fVar169 = auVar90._16_4_;
            fVar171 = auVar90._20_4_;
            fVar79 = auVar90._24_4_;
            auVar51._4_4_ = fVar133 * fVar133 * fVar133 * auVar83._4_4_ * -0.5;
            auVar51._0_4_ = fVar151 * fVar151 * fVar151 * auVar83._0_4_ * -0.5;
            auVar51._8_4_ = fVar134 * fVar134 * fVar134 * auVar83._8_4_ * -0.5;
            auVar51._12_4_ = fVar139 * fVar139 * fVar139 * auVar83._12_4_ * -0.5;
            auVar51._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar51._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
            auVar51._24_4_ = fVar79 * fVar79 * fVar79 * -0.0;
            auVar51._28_4_ = auVar116._28_4_;
            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar90 = vfmadd231ps_avx512vl(auVar51,auVar91,auVar90);
            auVar52._4_4_ = auVar116._4_4_ * auVar90._4_4_;
            auVar52._0_4_ = auVar116._0_4_ * auVar90._0_4_;
            auVar52._8_4_ = auVar116._8_4_ * auVar90._8_4_;
            auVar52._12_4_ = auVar116._12_4_ * auVar90._12_4_;
            auVar52._16_4_ = auVar116._16_4_ * auVar90._16_4_;
            auVar52._20_4_ = auVar116._20_4_ * auVar90._20_4_;
            auVar52._24_4_ = auVar116._24_4_ * auVar90._24_4_;
            auVar52._28_4_ = 0;
            auVar53._4_4_ = auVar90._4_4_ * -auVar115._4_4_;
            auVar53._0_4_ = auVar90._0_4_ * -auVar115._0_4_;
            auVar53._8_4_ = auVar90._8_4_ * -auVar115._8_4_;
            auVar53._12_4_ = auVar90._12_4_ * -auVar115._12_4_;
            auVar53._16_4_ = auVar90._16_4_ * -auVar115._16_4_;
            auVar53._20_4_ = auVar90._20_4_ * -auVar115._20_4_;
            auVar53._24_4_ = auVar90._24_4_ * -auVar115._24_4_;
            auVar53._28_4_ = auVar116._28_4_;
            auVar92 = vmulps_avx512vl(auVar90,auVar88);
            auVar90 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar88);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar118,auVar118);
            auVar102 = vrsqrt14ps_avx512vl(auVar90);
            auVar90 = vmulps_avx512vl(auVar90,auVar190);
            fVar151 = auVar102._0_4_;
            fVar133 = auVar102._4_4_;
            fVar134 = auVar102._8_4_;
            fVar139 = auVar102._12_4_;
            fVar169 = auVar102._16_4_;
            fVar171 = auVar102._20_4_;
            fVar79 = auVar102._24_4_;
            auVar54._4_4_ = fVar133 * fVar133 * fVar133 * auVar90._4_4_;
            auVar54._0_4_ = fVar151 * fVar151 * fVar151 * auVar90._0_4_;
            auVar54._8_4_ = fVar134 * fVar134 * fVar134 * auVar90._8_4_;
            auVar54._12_4_ = fVar139 * fVar139 * fVar139 * auVar90._12_4_;
            auVar54._16_4_ = fVar169 * fVar169 * fVar169 * auVar90._16_4_;
            auVar54._20_4_ = fVar171 * fVar171 * fVar171 * auVar90._20_4_;
            auVar54._24_4_ = fVar79 * fVar79 * fVar79 * auVar90._24_4_;
            auVar54._28_4_ = auVar90._28_4_;
            auVar90 = vfmadd231ps_avx512vl(auVar54,auVar91,auVar102);
            auVar55._4_4_ = auVar118._4_4_ * auVar90._4_4_;
            auVar55._0_4_ = auVar118._0_4_ * auVar90._0_4_;
            auVar55._8_4_ = auVar118._8_4_ * auVar90._8_4_;
            auVar55._12_4_ = auVar118._12_4_ * auVar90._12_4_;
            auVar55._16_4_ = auVar118._16_4_ * auVar90._16_4_;
            auVar55._20_4_ = auVar118._20_4_ * auVar90._20_4_;
            auVar55._24_4_ = auVar118._24_4_ * auVar90._24_4_;
            auVar55._28_4_ = auVar102._28_4_;
            auVar56._4_4_ = auVar90._4_4_ * auVar93._4_4_;
            auVar56._0_4_ = auVar90._0_4_ * auVar93._0_4_;
            auVar56._8_4_ = auVar90._8_4_ * auVar93._8_4_;
            auVar56._12_4_ = auVar90._12_4_ * auVar93._12_4_;
            auVar56._16_4_ = auVar90._16_4_ * auVar93._16_4_;
            auVar56._20_4_ = auVar90._20_4_ * auVar93._20_4_;
            auVar56._24_4_ = auVar90._24_4_ * auVar93._24_4_;
            auVar56._28_4_ = auVar93._28_4_;
            auVar93 = vmulps_avx512vl(auVar90,auVar88);
            auVar83 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar81),auVar89);
            auVar90 = ZEXT1632(auVar81);
            auVar6 = vfmadd213ps_fma(auVar53,auVar90,auVar98);
            auVar91 = vfmadd213ps_avx512vl(auVar92,auVar90,auVar95);
            auVar102 = vfmadd213ps_avx512vl(auVar55,ZEXT1632(auVar82),auVar99);
            auVar10 = vfnmadd213ps_fma(auVar52,auVar90,auVar89);
            auVar101 = ZEXT1632(auVar82);
            auVar197 = vfmadd213ps_fma(auVar56,auVar101,auVar87);
            auVar84 = vfnmadd213ps_fma(auVar53,auVar90,auVar98);
            auVar7 = vfmadd213ps_fma(auVar93,auVar101,auVar94);
            auVar98 = ZEXT1632(auVar81);
            auVar86 = vfnmadd231ps_fma(auVar95,auVar98,auVar92);
            auVar85 = vfnmadd213ps_fma(auVar55,auVar101,auVar99);
            auVar141 = vfnmadd213ps_fma(auVar56,auVar101,auVar87);
            auVar146 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar82),auVar93);
            auVar94 = vsubps_avx512vl(auVar102,ZEXT1632(auVar10));
            auVar93 = vsubps_avx(ZEXT1632(auVar197),ZEXT1632(auVar84));
            auVar90 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar86));
            auVar57._4_4_ = auVar93._4_4_ * auVar86._4_4_;
            auVar57._0_4_ = auVar93._0_4_ * auVar86._0_4_;
            auVar57._8_4_ = auVar93._8_4_ * auVar86._8_4_;
            auVar57._12_4_ = auVar93._12_4_ * auVar86._12_4_;
            auVar57._16_4_ = auVar93._16_4_ * 0.0;
            auVar57._20_4_ = auVar93._20_4_ * 0.0;
            auVar57._24_4_ = auVar93._24_4_ * 0.0;
            auVar57._28_4_ = auVar92._28_4_;
            auVar81 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar84),auVar90);
            auVar58._4_4_ = auVar90._4_4_ * auVar10._4_4_;
            auVar58._0_4_ = auVar90._0_4_ * auVar10._0_4_;
            auVar58._8_4_ = auVar90._8_4_ * auVar10._8_4_;
            auVar58._12_4_ = auVar90._12_4_ * auVar10._12_4_;
            auVar58._16_4_ = auVar90._16_4_ * 0.0;
            auVar58._20_4_ = auVar90._20_4_ * 0.0;
            auVar58._24_4_ = auVar90._24_4_ * 0.0;
            auVar58._28_4_ = auVar90._28_4_;
            auVar8 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar86),auVar94);
            auVar59._4_4_ = auVar84._4_4_ * auVar94._4_4_;
            auVar59._0_4_ = auVar84._0_4_ * auVar94._0_4_;
            auVar59._8_4_ = auVar84._8_4_ * auVar94._8_4_;
            auVar59._12_4_ = auVar84._12_4_ * auVar94._12_4_;
            auVar59._16_4_ = auVar94._16_4_ * 0.0;
            auVar59._20_4_ = auVar94._20_4_ * 0.0;
            auVar59._24_4_ = auVar94._24_4_ * 0.0;
            auVar59._28_4_ = auVar94._28_4_;
            auVar9 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar10),auVar93);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar88,ZEXT1632(auVar8));
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar81));
            uVar70 = vcmpps_avx512vl(auVar93,auVar88,2);
            bVar69 = (byte)uVar70;
            fVar150 = (float)((uint)(bVar69 & 1) * auVar83._0_4_ |
                             (uint)!(bool)(bVar69 & 1) * auVar85._0_4_);
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            fVar127 = (float)((uint)bVar17 * auVar83._4_4_ | (uint)!bVar17 * auVar85._4_4_);
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            fVar130 = (float)((uint)bVar17 * auVar83._8_4_ | (uint)!bVar17 * auVar85._8_4_);
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            fVar131 = (float)((uint)bVar17 * auVar83._12_4_ | (uint)!bVar17 * auVar85._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar130,CONCAT44(fVar127,fVar150))));
            fVar126 = (float)((uint)(bVar69 & 1) * auVar6._0_4_ |
                             (uint)!(bool)(bVar69 & 1) * auVar141._0_4_);
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            fVar129 = (float)((uint)bVar17 * auVar6._4_4_ | (uint)!bVar17 * auVar141._4_4_);
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            fVar128 = (float)((uint)bVar17 * auVar6._8_4_ | (uint)!bVar17 * auVar141._8_4_);
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            fVar132 = (float)((uint)bVar17 * auVar6._12_4_ | (uint)!bVar17 * auVar141._12_4_);
            auVar97 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar128,CONCAT44(fVar129,fVar126))));
            auVar119._0_4_ =
                 (float)((uint)(bVar69 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar146._0_4_);
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar17 * auVar91._4_4_ | (uint)!bVar17 * auVar146._4_4_);
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar17 * auVar91._8_4_ | (uint)!bVar17 * auVar146._8_4_);
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar17 * auVar91._12_4_ | (uint)!bVar17 * auVar146._12_4_);
            fVar133 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar91._16_4_);
            auVar119._16_4_ = fVar133;
            fVar134 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar91._20_4_);
            auVar119._20_4_ = fVar134;
            fVar151 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar91._24_4_);
            auVar119._24_4_ = fVar151;
            iVar1 = (uint)(byte)(uVar70 >> 7) * auVar91._28_4_;
            auVar119._28_4_ = iVar1;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar102);
            auVar120._0_4_ =
                 (uint)(bVar69 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar81._0_4_;
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar120._4_4_ = (uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * auVar81._4_4_;
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar120._8_4_ = (uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * auVar81._8_4_;
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar120._12_4_ = (uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * auVar81._12_4_;
            auVar120._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar93._16_4_;
            auVar120._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar93._20_4_;
            auVar120._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar93._24_4_;
            auVar120._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar197));
            auVar121._0_4_ =
                 (float)((uint)(bVar69 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar83._0_4_);
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * auVar83._4_4_);
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * auVar83._8_4_);
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * auVar83._12_4_);
            fVar139 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar93._16_4_);
            auVar121._16_4_ = fVar139;
            fVar169 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar93._20_4_);
            auVar121._20_4_ = fVar169;
            fVar171 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar93._24_4_);
            auVar121._24_4_ = fVar171;
            auVar121._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar7));
            auVar122._0_4_ =
                 (float)((uint)(bVar69 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar6._0_4_);
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar17 * auVar93._4_4_ | (uint)!bVar17 * auVar6._4_4_);
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar17 * auVar93._8_4_ | (uint)!bVar17 * auVar6._8_4_);
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar122._12_4_ = (float)((uint)bVar17 * auVar93._12_4_ | (uint)!bVar17 * auVar6._12_4_)
            ;
            fVar79 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar93._16_4_);
            auVar122._16_4_ = fVar79;
            fVar80 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar93._20_4_);
            auVar122._20_4_ = fVar80;
            fVar125 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar93._24_4_);
            auVar122._24_4_ = fVar125;
            iVar2 = (uint)(byte)(uVar70 >> 7) * auVar93._28_4_;
            auVar122._28_4_ = iVar2;
            auVar123._0_4_ =
                 (uint)(bVar69 & 1) * (int)auVar10._0_4_ |
                 (uint)!(bool)(bVar69 & 1) * auVar102._0_4_;
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar123._4_4_ = (uint)bVar17 * (int)auVar10._4_4_ | (uint)!bVar17 * auVar102._4_4_;
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar123._8_4_ = (uint)bVar17 * (int)auVar10._8_4_ | (uint)!bVar17 * auVar102._8_4_;
            bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar123._12_4_ = (uint)bVar17 * (int)auVar10._12_4_ | (uint)!bVar17 * auVar102._12_4_;
            auVar123._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar102._16_4_;
            auVar123._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar102._20_4_;
            auVar123._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar102._24_4_;
            auVar123._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar102._28_4_;
            bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar70 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar70 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar70 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar102 = vsubps_avx512vl(auVar123,auVar101);
            auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar84._12_4_ |
                                                    (uint)!bVar21 * auVar197._12_4_,
                                                    CONCAT48((uint)bVar19 * (int)auVar84._8_4_ |
                                                             (uint)!bVar19 * auVar197._8_4_,
                                                             CONCAT44((uint)bVar17 *
                                                                      (int)auVar84._4_4_ |
                                                                      (uint)!bVar17 * auVar197._4_4_
                                                                      ,(uint)(bVar69 & 1) *
                                                                       (int)auVar84._0_4_ |
                                                                       (uint)!(bool)(bVar69 & 1) *
                                                                       auVar197._0_4_)))),auVar97);
            auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar86._12_4_ |
                                                    (uint)!bVar22 * auVar7._12_4_,
                                                    CONCAT48((uint)bVar20 * (int)auVar86._8_4_ |
                                                             (uint)!bVar20 * auVar7._8_4_,
                                                             CONCAT44((uint)bVar18 *
                                                                      (int)auVar86._4_4_ |
                                                                      (uint)!bVar18 * auVar7._4_4_,
                                                                      (uint)(bVar69 & 1) *
                                                                      (int)auVar86._0_4_ |
                                                                      (uint)!(bool)(bVar69 & 1) *
                                                                      auVar7._0_4_)))),auVar119);
            auVar92 = vsubps_avx(auVar101,auVar120);
            auVar94 = vsubps_avx(auVar97,auVar121);
            auVar95 = vsubps_avx(auVar119,auVar122);
            auVar60._4_4_ = auVar91._4_4_ * fVar127;
            auVar60._0_4_ = auVar91._0_4_ * fVar150;
            auVar60._8_4_ = auVar91._8_4_ * fVar130;
            auVar60._12_4_ = auVar91._12_4_ * fVar131;
            auVar60._16_4_ = auVar91._16_4_ * 0.0;
            auVar60._20_4_ = auVar91._20_4_ * 0.0;
            auVar60._24_4_ = auVar91._24_4_ * 0.0;
            auVar60._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar60,auVar119,auVar102);
            auVar157._0_4_ = fVar126 * auVar102._0_4_;
            auVar157._4_4_ = fVar129 * auVar102._4_4_;
            auVar157._8_4_ = fVar128 * auVar102._8_4_;
            auVar157._12_4_ = fVar132 * auVar102._12_4_;
            auVar157._16_4_ = auVar102._16_4_ * 0.0;
            auVar157._20_4_ = auVar102._20_4_ * 0.0;
            auVar157._24_4_ = auVar102._24_4_ * 0.0;
            auVar157._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar157,auVar101,auVar90);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar88,ZEXT1632(auVar81));
            auVar161._0_4_ = auVar90._0_4_ * auVar119._0_4_;
            auVar161._4_4_ = auVar90._4_4_ * auVar119._4_4_;
            auVar161._8_4_ = auVar90._8_4_ * auVar119._8_4_;
            auVar161._12_4_ = auVar90._12_4_ * auVar119._12_4_;
            auVar161._16_4_ = auVar90._16_4_ * fVar133;
            auVar161._20_4_ = auVar90._20_4_ * fVar134;
            auVar161._24_4_ = auVar90._24_4_ * fVar151;
            auVar161._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar161,auVar97,auVar91);
            auVar96 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar81));
            auVar93 = vmulps_avx512vl(auVar95,auVar120);
            auVar93 = vfmsub231ps_avx512vl(auVar93,auVar92,auVar122);
            auVar61._4_4_ = auVar94._4_4_ * auVar122._4_4_;
            auVar61._0_4_ = auVar94._0_4_ * auVar122._0_4_;
            auVar61._8_4_ = auVar94._8_4_ * auVar122._8_4_;
            auVar61._12_4_ = auVar94._12_4_ * auVar122._12_4_;
            auVar61._16_4_ = auVar94._16_4_ * fVar79;
            auVar61._20_4_ = auVar94._20_4_ * fVar80;
            auVar61._24_4_ = auVar94._24_4_ * fVar125;
            auVar61._28_4_ = iVar2;
            auVar81 = vfmsub231ps_fma(auVar61,auVar121,auVar95);
            auVar162._0_4_ = auVar121._0_4_ * auVar92._0_4_;
            auVar162._4_4_ = auVar121._4_4_ * auVar92._4_4_;
            auVar162._8_4_ = auVar121._8_4_ * auVar92._8_4_;
            auVar162._12_4_ = auVar121._12_4_ * auVar92._12_4_;
            auVar162._16_4_ = fVar139 * auVar92._16_4_;
            auVar162._20_4_ = fVar169 * auVar92._20_4_;
            auVar162._24_4_ = fVar171 * auVar92._24_4_;
            auVar162._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar162,auVar94,auVar120);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar88,auVar93);
            auVar89 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar81));
            auVar93 = vmaxps_avx(auVar96,auVar89);
            uVar140 = vcmpps_avx512vl(auVar93,auVar88,2);
            bVar78 = bVar78 & (byte)uVar140;
            if (bVar78 != 0) {
              uVar135 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar185._4_4_ = uVar135;
              auVar185._0_4_ = uVar135;
              auVar185._8_4_ = uVar135;
              auVar185._12_4_ = uVar135;
              auVar185._16_4_ = uVar135;
              auVar185._20_4_ = uVar135;
              auVar185._24_4_ = uVar135;
              auVar185._28_4_ = uVar135;
              auVar186 = ZEXT3264(auVar185);
              auVar62._4_4_ = auVar95._4_4_ * auVar90._4_4_;
              auVar62._0_4_ = auVar95._0_4_ * auVar90._0_4_;
              auVar62._8_4_ = auVar95._8_4_ * auVar90._8_4_;
              auVar62._12_4_ = auVar95._12_4_ * auVar90._12_4_;
              auVar62._16_4_ = auVar95._16_4_ * auVar90._16_4_;
              auVar62._20_4_ = auVar95._20_4_ * auVar90._20_4_;
              auVar62._24_4_ = auVar95._24_4_ * auVar90._24_4_;
              auVar62._28_4_ = auVar93._28_4_;
              auVar6 = vfmsub231ps_fma(auVar62,auVar94,auVar91);
              auVar63._4_4_ = auVar91._4_4_ * auVar92._4_4_;
              auVar63._0_4_ = auVar91._0_4_ * auVar92._0_4_;
              auVar63._8_4_ = auVar91._8_4_ * auVar92._8_4_;
              auVar63._12_4_ = auVar91._12_4_ * auVar92._12_4_;
              auVar63._16_4_ = auVar91._16_4_ * auVar92._16_4_;
              auVar63._20_4_ = auVar91._20_4_ * auVar92._20_4_;
              auVar63._24_4_ = auVar91._24_4_ * auVar92._24_4_;
              auVar63._28_4_ = auVar91._28_4_;
              auVar83 = vfmsub231ps_fma(auVar63,auVar102,auVar95);
              auVar64._4_4_ = auVar94._4_4_ * auVar102._4_4_;
              auVar64._0_4_ = auVar94._0_4_ * auVar102._0_4_;
              auVar64._8_4_ = auVar94._8_4_ * auVar102._8_4_;
              auVar64._12_4_ = auVar94._12_4_ * auVar102._12_4_;
              auVar64._16_4_ = auVar94._16_4_ * auVar102._16_4_;
              auVar64._20_4_ = auVar94._20_4_ * auVar102._20_4_;
              auVar64._24_4_ = auVar94._24_4_ * auVar102._24_4_;
              auVar64._28_4_ = auVar94._28_4_;
              auVar197 = vfmsub231ps_fma(auVar64,auVar92,auVar90);
              auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar83),ZEXT1632(auVar197));
              auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar6),auVar88);
              auVar90 = vrcp14ps_avx512vl(auVar93);
              auVar92 = auVar200._0_32_;
              auVar91 = vfnmadd213ps_avx512vl(auVar90,auVar93,auVar92);
              auVar81 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
              auVar65._4_4_ = auVar197._4_4_ * auVar119._4_4_;
              auVar65._0_4_ = auVar197._0_4_ * auVar119._0_4_;
              auVar65._8_4_ = auVar197._8_4_ * auVar119._8_4_;
              auVar65._12_4_ = auVar197._12_4_ * auVar119._12_4_;
              auVar65._16_4_ = fVar133 * 0.0;
              auVar65._20_4_ = fVar134 * 0.0;
              auVar65._24_4_ = fVar151 * 0.0;
              auVar65._28_4_ = iVar1;
              auVar83 = vfmadd231ps_fma(auVar65,auVar97,ZEXT1632(auVar83));
              auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar101,ZEXT1632(auVar6));
              fVar151 = auVar81._0_4_;
              fVar133 = auVar81._4_4_;
              fVar134 = auVar81._8_4_;
              fVar139 = auVar81._12_4_;
              local_3a0 = ZEXT1632(CONCAT412(auVar83._12_4_ * fVar139,
                                             CONCAT48(auVar83._8_4_ * fVar134,
                                                      CONCAT44(auVar83._4_4_ * fVar133,
                                                               auVar83._0_4_ * fVar151))));
              uVar140 = vcmpps_avx512vl(local_3a0,auVar185,2);
              auVar67._4_4_ = uStack_47c;
              auVar67._0_4_ = local_480;
              auVar67._8_4_ = uStack_478;
              auVar67._12_4_ = uStack_474;
              auVar67._16_4_ = uStack_470;
              auVar67._20_4_ = uStack_46c;
              auVar67._24_4_ = uStack_468;
              auVar67._28_4_ = uStack_464;
              uVar25 = vcmpps_avx512vl(local_3a0,auVar67,0xd);
              bVar78 = (byte)uVar140 & (byte)uVar25 & bVar78;
              if (bVar78 != 0) {
                uVar140 = vcmpps_avx512vl(auVar93,auVar88,4);
                bVar78 = bVar78 & (byte)uVar140;
                auVar192 = ZEXT3264(local_6c0);
                if (bVar78 != 0) {
                  fVar169 = auVar96._0_4_ * fVar151;
                  fVar171 = auVar96._4_4_ * fVar133;
                  auVar66._4_4_ = fVar171;
                  auVar66._0_4_ = fVar169;
                  fVar79 = auVar96._8_4_ * fVar134;
                  auVar66._8_4_ = fVar79;
                  fVar80 = auVar96._12_4_ * fVar139;
                  auVar66._12_4_ = fVar80;
                  fVar125 = auVar96._16_4_ * 0.0;
                  auVar66._16_4_ = fVar125;
                  fVar150 = auVar96._20_4_ * 0.0;
                  auVar66._20_4_ = fVar150;
                  fVar126 = auVar96._24_4_ * 0.0;
                  auVar66._24_4_ = fVar126;
                  auVar66._28_4_ = auVar93._28_4_;
                  auVar90 = vsubps_avx512vl(auVar92,auVar66);
                  local_3e0._0_4_ =
                       (float)((uint)(bVar69 & 1) * (int)fVar169 |
                              (uint)!(bool)(bVar69 & 1) * auVar90._0_4_);
                  bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
                  local_3e0._4_4_ =
                       (float)((uint)bVar17 * (int)fVar171 | (uint)!bVar17 * auVar90._4_4_);
                  bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
                  local_3e0._8_4_ =
                       (float)((uint)bVar17 * (int)fVar79 | (uint)!bVar17 * auVar90._8_4_);
                  bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
                  local_3e0._12_4_ =
                       (float)((uint)bVar17 * (int)fVar80 | (uint)!bVar17 * auVar90._12_4_);
                  bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
                  local_3e0._16_4_ =
                       (float)((uint)bVar17 * (int)fVar125 | (uint)!bVar17 * auVar90._16_4_);
                  bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
                  local_3e0._20_4_ =
                       (float)((uint)bVar17 * (int)fVar150 | (uint)!bVar17 * auVar90._20_4_);
                  bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
                  local_3e0._24_4_ =
                       (float)((uint)bVar17 * (int)fVar126 | (uint)!bVar17 * auVar90._24_4_);
                  bVar17 = SUB81(uVar70 >> 7,0);
                  local_3e0._28_4_ =
                       (float)((uint)bVar17 * auVar93._28_4_ | (uint)!bVar17 * auVar90._28_4_);
                  auVar93 = vsubps_avx(ZEXT1632(auVar82),auVar98);
                  auVar81 = vfmadd213ps_fma(auVar93,local_3e0,auVar98);
                  uVar135 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                  auVar30._4_4_ = uVar135;
                  auVar30._0_4_ = uVar135;
                  auVar30._8_4_ = uVar135;
                  auVar30._12_4_ = uVar135;
                  auVar30._16_4_ = uVar135;
                  auVar30._20_4_ = uVar135;
                  auVar30._24_4_ = uVar135;
                  auVar30._28_4_ = uVar135;
                  auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                               CONCAT48(auVar81._8_4_ +
                                                                        auVar81._8_4_,
                                                                        CONCAT44(auVar81._4_4_ +
                                                                                 auVar81._4_4_,
                                                                                 auVar81._0_4_ +
                                                                                 auVar81._0_4_)))),
                                            auVar30);
                  uVar140 = vcmpps_avx512vl(local_3a0,auVar93,6);
                  if (((byte)uVar140 & bVar78) != 0) {
                    auVar145._0_4_ = auVar89._0_4_ * fVar151;
                    auVar145._4_4_ = auVar89._4_4_ * fVar133;
                    auVar145._8_4_ = auVar89._8_4_ * fVar134;
                    auVar145._12_4_ = auVar89._12_4_ * fVar139;
                    auVar145._16_4_ = auVar89._16_4_ * 0.0;
                    auVar145._20_4_ = auVar89._20_4_ * 0.0;
                    auVar145._24_4_ = auVar89._24_4_ * 0.0;
                    auVar145._28_4_ = 0;
                    auVar93 = vsubps_avx512vl(auVar92,auVar145);
                    auVar124._0_4_ =
                         (uint)(bVar69 & 1) * (int)auVar145._0_4_ |
                         (uint)!(bool)(bVar69 & 1) * auVar93._0_4_;
                    bVar17 = (bool)((byte)(uVar70 >> 1) & 1);
                    auVar124._4_4_ =
                         (uint)bVar17 * (int)auVar145._4_4_ | (uint)!bVar17 * auVar93._4_4_;
                    bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
                    auVar124._8_4_ =
                         (uint)bVar17 * (int)auVar145._8_4_ | (uint)!bVar17 * auVar93._8_4_;
                    bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
                    auVar124._12_4_ =
                         (uint)bVar17 * (int)auVar145._12_4_ | (uint)!bVar17 * auVar93._12_4_;
                    bVar17 = (bool)((byte)(uVar70 >> 4) & 1);
                    auVar124._16_4_ =
                         (uint)bVar17 * (int)auVar145._16_4_ | (uint)!bVar17 * auVar93._16_4_;
                    bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
                    auVar124._20_4_ =
                         (uint)bVar17 * (int)auVar145._20_4_ | (uint)!bVar17 * auVar93._20_4_;
                    bVar17 = (bool)((byte)(uVar70 >> 6) & 1);
                    auVar124._24_4_ =
                         (uint)bVar17 * (int)auVar145._24_4_ | (uint)!bVar17 * auVar93._24_4_;
                    auVar124._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar93._28_4_;
                    auVar31._8_4_ = 0x40000000;
                    auVar31._0_8_ = 0x4000000040000000;
                    auVar31._12_4_ = 0x40000000;
                    auVar31._16_4_ = 0x40000000;
                    auVar31._20_4_ = 0x40000000;
                    auVar31._24_4_ = 0x40000000;
                    auVar31._28_4_ = 0x40000000;
                    local_3c0 = vfmsub132ps_avx512vl(auVar124,auVar92,auVar31);
                    local_380 = (undefined4)lVar77;
                    local_370 = local_670._0_8_;
                    uStack_368 = local_670._8_8_;
                    local_360 = local_680._0_8_;
                    uStack_358 = local_680._8_8_;
                    local_350 = local_690._0_8_;
                    uStack_348 = local_690._8_8_;
                    pGVar14 = (context->scene->geometries).items[uVar12].ptr;
                    if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar69 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar69 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar81 = vcvtsi2ss_avx512f(auVar100._0_16_,local_380);
                      fVar151 = auVar81._0_4_;
                      local_320[0] = (fVar151 + local_3e0._0_4_ + 0.0) * (float)local_4a0;
                      local_320[1] = (fVar151 + local_3e0._4_4_ + 1.0) * local_4a0._4_4_;
                      local_320[2] = (fVar151 + local_3e0._8_4_ + 2.0) * fStack_498;
                      local_320[3] = (fVar151 + local_3e0._12_4_ + 3.0) * fStack_494;
                      fStack_310 = (fVar151 + local_3e0._16_4_ + 4.0) * fStack_490;
                      fStack_30c = (fVar151 + local_3e0._20_4_ + 5.0) * fStack_48c;
                      fStack_308 = (fVar151 + local_3e0._24_4_ + 6.0) * fStack_488;
                      fStack_304 = fVar151 + local_3e0._28_4_ + 7.0;
                      local_300 = local_3c0;
                      local_2e0 = local_3a0;
                      lVar71 = 0;
                      uVar75 = (ulong)((byte)uVar140 & bVar78);
                      for (uVar70 = uVar75; (uVar70 & 1) == 0;
                          uVar70 = uVar70 >> 1 | 0x8000000000000000) {
                        lVar71 = lVar71 + 1;
                      }
                      local_520._0_4_ = (int)uVar74;
                      local_2c0 = auVar185;
                      local_37c = iVar13;
                      do {
                        auVar197 = auVar198._0_16_;
                        fVar151 = local_320[lVar71];
                        auVar143._4_4_ = fVar151;
                        auVar143._0_4_ = fVar151;
                        auVar143._8_4_ = fVar151;
                        auVar143._12_4_ = fVar151;
                        local_220._16_4_ = fVar151;
                        local_220._0_16_ = auVar143;
                        local_220._20_4_ = fVar151;
                        local_220._24_4_ = fVar151;
                        local_220._28_4_ = fVar151;
                        local_420._0_8_ = lVar71;
                        local_200 = *(undefined4 *)(local_300 + lVar71 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2e0 + lVar71 * 4);
                        local_6f0.context = context->user;
                        fVar133 = 1.0 - fVar151;
                        auVar6 = vfnmadd231ss_fma(ZEXT416((uint)(fVar151 * (fVar133 + fVar133))),
                                                  ZEXT416((uint)fVar133),ZEXT416((uint)fVar133));
                        auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar143,
                                                  ZEXT416(0xc0a00000));
                        auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * 3.0)),
                                                  ZEXT416((uint)(fVar151 + fVar151)),auVar81);
                        auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar143,
                                                  ZEXT416(0x40000000));
                        auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133 * -3.0)),
                                                  ZEXT416((uint)(fVar133 + fVar133)),auVar81);
                        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),auVar143,
                                                  ZEXT416((uint)(fVar133 * -2.0)));
                        fVar151 = auVar6._0_4_ * 0.5;
                        fVar133 = auVar82._0_4_ * 0.5;
                        fVar134 = auVar81._0_4_ * 0.5;
                        fVar139 = auVar83._0_4_ * 0.5;
                        auVar154._0_4_ = fVar139 * (float)local_4d0._0_4_;
                        auVar154._4_4_ = fVar139 * (float)local_4d0._4_4_;
                        auVar154._8_4_ = fVar139 * fStack_4c8;
                        auVar154._12_4_ = fVar139 * fStack_4c4;
                        auVar165._4_4_ = fVar134;
                        auVar165._0_4_ = fVar134;
                        auVar165._8_4_ = fVar134;
                        auVar165._12_4_ = fVar134;
                        auVar81 = vfmadd132ps_fma(auVar165,auVar154,local_690);
                        auVar155._4_4_ = fVar133;
                        auVar155._0_4_ = fVar133;
                        auVar155._8_4_ = fVar133;
                        auVar155._12_4_ = fVar133;
                        auVar81 = vfmadd132ps_fma(auVar155,auVar81,local_680);
                        auVar137._4_4_ = fVar151;
                        auVar137._0_4_ = fVar151;
                        auVar137._8_4_ = fVar151;
                        auVar137._12_4_ = fVar151;
                        auVar81 = vfmadd132ps_fma(auVar137,auVar81,local_670);
                        local_280 = auVar81._0_4_;
                        auVar163._8_4_ = 1;
                        auVar163._0_8_ = 0x100000001;
                        auVar163._12_4_ = 1;
                        auVar163._16_4_ = 1;
                        auVar163._20_4_ = 1;
                        auVar163._24_4_ = 1;
                        auVar163._28_4_ = 1;
                        local_260 = vpermps_avx2(auVar163,ZEXT1632(auVar81));
                        auVar168._8_4_ = 2;
                        auVar168._0_8_ = 0x200000002;
                        auVar168._12_4_ = 2;
                        auVar168._16_4_ = 2;
                        auVar168._20_4_ = 2;
                        auVar168._24_4_ = 2;
                        auVar168._28_4_ = 2;
                        local_240 = vpermps_avx2(auVar168,ZEXT1632(auVar81));
                        uStack_27c = local_280;
                        uStack_278 = local_280;
                        uStack_274 = local_280;
                        uStack_270 = local_280;
                        uStack_26c = local_280;
                        uStack_268 = local_280;
                        uStack_264 = local_280;
                        uStack_1fc = local_200;
                        uStack_1f8 = local_200;
                        uStack_1f4 = local_200;
                        uStack_1f0 = local_200;
                        uStack_1ec = local_200;
                        uStack_1e8 = local_200;
                        uStack_1e4 = local_200;
                        local_1e0 = local_440._0_8_;
                        uStack_1d8 = local_440._8_8_;
                        uStack_1d0 = local_440._16_8_;
                        uStack_1c8 = local_440._24_8_;
                        local_1c0 = local_460;
                        vpcmpeqd_avx2(local_460,local_460);
                        local_1a0 = (local_6f0.context)->instID[0];
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = (local_6f0.context)->instPrimID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_600 = local_2a0;
                        local_6f0.valid = (int *)local_600;
                        local_6f0.geometryUserPtr = pGVar14->userPtr;
                        local_6f0.hit = (RTCHitN *)&local_280;
                        local_6f0.N = 8;
                        local_4c0._0_8_ = uVar75;
                        local_6f0.ray = (RTCRayN *)ray;
                        if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar14->occlusionFilterN)(&local_6f0);
                          auVar186 = ZEXT3264(local_2c0);
                          uVar74 = (ulong)(uint)local_520._0_4_;
                          auVar192 = ZEXT3264(local_6c0);
                          auVar193 = ZEXT3264(local_580);
                          auVar196 = ZEXT3264(local_560);
                          auVar195 = ZEXT3264(local_500);
                          auVar194 = ZEXT3264(local_540);
                          auVar81 = vxorps_avx512vl(auVar197,auVar197);
                          auVar198 = ZEXT1664(auVar81);
                          uVar75 = local_4c0._0_8_;
                        }
                        auVar81 = auVar198._0_16_;
                        if (local_600 == (undefined1  [32])0x0) {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar200 = ZEXT3264(auVar93);
                          auVar199 = ZEXT3264(local_660);
                          auVar202 = ZEXT3264(local_620);
                          auVar201 = ZEXT3264(local_640);
                        }
                        else {
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var16)(&local_6f0);
                            auVar186 = ZEXT3264(local_2c0);
                            uVar74 = (ulong)(uint)local_520._0_4_;
                            auVar192 = ZEXT3264(local_6c0);
                            auVar193 = ZEXT3264(local_580);
                            auVar196 = ZEXT3264(local_560);
                            auVar195 = ZEXT3264(local_500);
                            auVar194 = ZEXT3264(local_540);
                            auVar81 = vxorps_avx512vl(auVar81,auVar81);
                            auVar198 = ZEXT1664(auVar81);
                            uVar75 = local_4c0._0_8_;
                          }
                          uVar70 = vptestmd_avx512vl(local_600,local_600);
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar17 = (bool)((byte)uVar70 & 1);
                          bVar18 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar24 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_6f0.ray + 0x100) =
                               (uint)bVar17 * auVar93._0_4_ |
                               (uint)!bVar17 * *(int *)(local_6f0.ray + 0x100);
                          *(uint *)(local_6f0.ray + 0x104) =
                               (uint)bVar18 * auVar93._4_4_ |
                               (uint)!bVar18 * *(int *)(local_6f0.ray + 0x104);
                          *(uint *)(local_6f0.ray + 0x108) =
                               (uint)bVar19 * auVar93._8_4_ |
                               (uint)!bVar19 * *(int *)(local_6f0.ray + 0x108);
                          *(uint *)(local_6f0.ray + 0x10c) =
                               (uint)bVar20 * auVar93._12_4_ |
                               (uint)!bVar20 * *(int *)(local_6f0.ray + 0x10c);
                          *(uint *)(local_6f0.ray + 0x110) =
                               (uint)bVar21 * auVar93._16_4_ |
                               (uint)!bVar21 * *(int *)(local_6f0.ray + 0x110);
                          *(uint *)(local_6f0.ray + 0x114) =
                               (uint)bVar22 * auVar93._20_4_ |
                               (uint)!bVar22 * *(int *)(local_6f0.ray + 0x114);
                          *(uint *)(local_6f0.ray + 0x118) =
                               (uint)bVar23 * auVar93._24_4_ |
                               (uint)!bVar23 * *(int *)(local_6f0.ray + 0x118);
                          *(uint *)(local_6f0.ray + 0x11c) =
                               (uint)bVar24 * auVar93._28_4_ |
                               (uint)!bVar24 * *(int *)(local_6f0.ray + 0x11c);
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar200 = ZEXT3264(auVar93);
                          auVar199 = ZEXT3264(local_660);
                          auVar202 = ZEXT3264(local_620);
                          auVar201 = ZEXT3264(local_640);
                          if (local_600 != (undefined1  [32])0x0) {
                            bVar69 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x100) = auVar186._0_4_;
                        bVar69 = 0;
                        lVar71 = 0;
                        uVar75 = uVar75 ^ 1L << (local_420._0_8_ & 0x3f);
                        for (uVar70 = uVar75; (uVar70 & 1) == 0;
                            uVar70 = uVar70 >> 1 | 0x8000000000000000) {
                          lVar71 = lVar71 + 1;
                        }
                      } while (uVar75 != 0);
                    }
                    uVar74 = CONCAT71((int7)(uVar74 >> 8),(byte)uVar74 | bVar69);
                  }
                }
                goto LAB_01e86de5;
              }
            }
            auVar192 = ZEXT3264(local_6c0);
          }
LAB_01e86de5:
          lVar77 = lVar77 + 8;
        } while ((int)lVar77 < iVar13);
      }
      bVar78 = (byte)uVar74;
      if ((uVar74 & 1) != 0) break;
      uVar135 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar29._4_4_ = uVar135;
      auVar29._0_4_ = uVar135;
      auVar29._8_4_ = uVar135;
      auVar29._12_4_ = uVar135;
      auVar29._16_4_ = uVar135;
      auVar29._20_4_ = uVar135;
      auVar29._24_4_ = uVar135;
      auVar29._28_4_ = uVar135;
      uVar140 = vcmpps_avx512vl(local_80,auVar29,2);
      uVar76 = (uint)uVar72 & (uint)uVar72 + 0xff & (uint)uVar140;
      uVar72 = (ulong)uVar76;
    } while (uVar76 != 0);
  }
  return (bool)(bVar78 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }